

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx2::CurveNvIntersectorK<8,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  RTCFilterFunctionN p_Var13;
  code *pcVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  long lVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  bool bVar83;
  undefined1 auVar84 [32];
  bool bVar85;
  long lVar86;
  bool bVar87;
  bool bVar88;
  bool bVar89;
  bool bVar90;
  bool bVar91;
  bool bVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined8 uVar99;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [28];
  undefined1 auVar106 [24];
  int iVar107;
  uint uVar108;
  ulong uVar109;
  uint uVar110;
  ulong uVar111;
  uint uVar112;
  long lVar113;
  Geometry *pGVar114;
  ulong uVar115;
  undefined4 uVar116;
  undefined8 uVar117;
  float fVar136;
  undefined1 auVar118 [16];
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar135;
  float fVar137;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar119 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar120 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  float fVar141;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar156;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar157;
  undefined1 auVar159 [16];
  float fVar158;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar160 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar179 [64];
  float fVar180;
  undefined1 auVar181 [16];
  float fVar186;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined8 uVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar224 [64];
  undefined4 uVar225;
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_920 [32];
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  RTCFilterFunctionNArguments local_7d0;
  undefined1 local_7a0 [32];
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined1 (*local_728) [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined4 local_600;
  undefined4 uStack_5fc;
  undefined4 uStack_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  int local_4a0;
  int local_49c;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined1 local_440 [32];
  float local_420 [4];
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar155 [64];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar185 [32];
  
  PVar12 = prim[1];
  uVar115 = (ulong)(byte)PVar12;
  lVar86 = uVar115 * 0x19;
  fVar158 = *(float *)(prim + lVar86 + 0x12);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar15 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + lVar86 + 6));
  auVar118._0_4_ = fVar158 * auVar15._0_4_;
  auVar118._4_4_ = fVar158 * auVar15._4_4_;
  auVar118._8_4_ = fVar158 * auVar15._8_4_;
  auVar118._12_4_ = fVar158 * auVar15._12_4_;
  auVar209._0_4_ = fVar158 * auVar16._0_4_;
  auVar209._4_4_ = fVar158 * auVar16._4_4_;
  auVar209._8_4_ = fVar158 * auVar16._8_4_;
  auVar209._12_4_ = fVar158 * auVar16._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar115 * 4 + 6);
  auVar121 = vpmovsxbd_avx2(auVar15);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar115 * 5 + 6);
  auVar132 = vpmovsxbd_avx2(auVar16);
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *(ulong *)(prim + uVar115 * 6 + 6);
  auVar128 = vpmovsxbd_avx2(auVar190);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar115 * 0xb + 6);
  auVar147 = vpmovsxbd_avx2(auVar195);
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar12 * 0xc) + 6);
  auVar203 = vpmovsxbd_avx2(auVar7);
  auVar203 = vcvtdq2ps_avx(auVar203);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (uint)(byte)PVar12 * 0xc + uVar115 + 6);
  auVar175 = vpmovsxbd_avx2(auVar8);
  auVar175 = vcvtdq2ps_avx(auVar175);
  uVar109 = (ulong)(uint)((int)(uVar115 * 9) * 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar109 + 6);
  auVar229 = vpmovsxbd_avx2(auVar9);
  auVar229 = vcvtdq2ps_avx(auVar229);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar109 + uVar115 + 6);
  auVar18 = vpmovsxbd_avx2(auVar10);
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar109 = (ulong)(uint)((int)(uVar115 * 5) << 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar109 + 6);
  auVar215 = vpmovsxbd_avx2(auVar11);
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar236._4_4_ = auVar209._0_4_;
  auVar236._0_4_ = auVar209._0_4_;
  auVar236._8_4_ = auVar209._0_4_;
  auVar236._12_4_ = auVar209._0_4_;
  auVar236._16_4_ = auVar209._0_4_;
  auVar236._20_4_ = auVar209._0_4_;
  auVar236._24_4_ = auVar209._0_4_;
  auVar236._28_4_ = auVar209._0_4_;
  auVar15 = vmovshdup_avx(auVar209);
  uVar208 = auVar15._0_8_;
  auVar240._8_8_ = uVar208;
  auVar240._0_8_ = uVar208;
  auVar240._16_8_ = uVar208;
  auVar240._24_8_ = uVar208;
  auVar15 = vshufps_avx(auVar209,auVar209,0xaa);
  fVar158 = auVar15._0_4_;
  auVar224._0_4_ = fVar158 * auVar128._0_4_;
  fVar157 = auVar15._4_4_;
  auVar224._4_4_ = fVar157 * auVar128._4_4_;
  auVar224._8_4_ = fVar158 * auVar128._8_4_;
  auVar224._12_4_ = fVar157 * auVar128._12_4_;
  auVar224._16_4_ = fVar158 * auVar128._16_4_;
  auVar224._20_4_ = fVar157 * auVar128._20_4_;
  auVar224._28_36_ = in_ZMM12._28_36_;
  auVar224._24_4_ = fVar158 * auVar128._24_4_;
  auVar223._0_4_ = auVar175._0_4_ * fVar158;
  auVar223._4_4_ = auVar175._4_4_ * fVar157;
  auVar223._8_4_ = auVar175._8_4_ * fVar158;
  auVar223._12_4_ = auVar175._12_4_ * fVar157;
  auVar223._16_4_ = auVar175._16_4_ * fVar158;
  auVar223._20_4_ = auVar175._20_4_ * fVar157;
  auVar223._28_36_ = in_ZMM10._28_36_;
  auVar223._24_4_ = auVar175._24_4_ * fVar158;
  auVar174._0_4_ = auVar215._0_4_ * fVar158;
  auVar174._4_4_ = auVar215._4_4_ * fVar157;
  auVar174._8_4_ = auVar215._8_4_ * fVar158;
  auVar174._12_4_ = auVar215._12_4_ * fVar157;
  auVar174._16_4_ = auVar215._16_4_ * fVar158;
  auVar174._20_4_ = auVar215._20_4_ * fVar157;
  auVar174._24_4_ = auVar215._24_4_ * fVar158;
  auVar174._28_4_ = 0;
  auVar15 = vfmadd231ps_fma(auVar224._0_32_,auVar240,auVar132);
  auVar16 = vfmadd231ps_fma(auVar223._0_32_,auVar240,auVar203);
  auVar190 = vfmadd231ps_fma(auVar174,auVar18,auVar240);
  auVar195 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar236,auVar121);
  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar236,auVar147);
  auVar224 = ZEXT1664(auVar16);
  auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar229,auVar236);
  auVar237._4_4_ = auVar118._0_4_;
  auVar237._0_4_ = auVar118._0_4_;
  auVar237._8_4_ = auVar118._0_4_;
  auVar237._12_4_ = auVar118._0_4_;
  auVar237._16_4_ = auVar118._0_4_;
  auVar237._20_4_ = auVar118._0_4_;
  auVar237._24_4_ = auVar118._0_4_;
  auVar237._28_4_ = auVar118._0_4_;
  auVar15 = vmovshdup_avx(auVar118);
  uVar208 = auVar15._0_8_;
  auVar241._8_8_ = uVar208;
  auVar241._0_8_ = uVar208;
  auVar241._16_8_ = uVar208;
  auVar241._24_8_ = uVar208;
  auVar15 = vshufps_avx(auVar118,auVar118,0xaa);
  fVar158 = auVar15._0_4_;
  auVar212._0_4_ = fVar158 * auVar128._0_4_;
  fVar157 = auVar15._4_4_;
  auVar212._4_4_ = fVar157 * auVar128._4_4_;
  auVar212._8_4_ = fVar158 * auVar128._8_4_;
  auVar212._12_4_ = fVar157 * auVar128._12_4_;
  auVar212._16_4_ = fVar158 * auVar128._16_4_;
  auVar212._20_4_ = fVar157 * auVar128._20_4_;
  auVar212._24_4_ = fVar158 * auVar128._24_4_;
  auVar212._28_4_ = 0;
  auVar222._4_4_ = auVar175._4_4_ * fVar157;
  auVar222._0_4_ = auVar175._0_4_ * fVar158;
  auVar222._8_4_ = auVar175._8_4_ * fVar158;
  auVar222._12_4_ = auVar175._12_4_ * fVar157;
  auVar222._16_4_ = auVar175._16_4_ * fVar158;
  auVar222._20_4_ = auVar175._20_4_ * fVar157;
  auVar222._24_4_ = auVar175._24_4_ * fVar158;
  auVar222._28_4_ = auVar128._28_4_;
  auVar128._4_4_ = auVar215._4_4_ * fVar157;
  auVar128._0_4_ = auVar215._0_4_ * fVar158;
  auVar128._8_4_ = auVar215._8_4_ * fVar158;
  auVar128._12_4_ = auVar215._12_4_ * fVar157;
  auVar128._16_4_ = auVar215._16_4_ * fVar158;
  auVar128._20_4_ = auVar215._20_4_ * fVar157;
  auVar128._24_4_ = auVar215._24_4_ * fVar158;
  auVar128._28_4_ = fVar157;
  auVar15 = vfmadd231ps_fma(auVar212,auVar241,auVar132);
  auVar7 = vfmadd231ps_fma(auVar222,auVar241,auVar203);
  auVar8 = vfmadd231ps_fma(auVar128,auVar241,auVar18);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar237,auVar121);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar237,auVar147);
  local_2c0._8_4_ = 0x7fffffff;
  local_2c0._0_8_ = 0x7fffffff7fffffff;
  local_2c0._12_4_ = 0x7fffffff;
  local_2c0._16_4_ = 0x7fffffff;
  local_2c0._20_4_ = 0x7fffffff;
  local_2c0._24_4_ = 0x7fffffff;
  local_2c0._28_4_ = 0x7fffffff;
  auVar122._8_4_ = 0x219392ef;
  auVar122._0_8_ = 0x219392ef219392ef;
  auVar122._12_4_ = 0x219392ef;
  auVar122._16_4_ = 0x219392ef;
  auVar122._20_4_ = 0x219392ef;
  auVar122._24_4_ = 0x219392ef;
  auVar122._28_4_ = 0x219392ef;
  auVar121 = vandps_avx(ZEXT1632(auVar195),local_2c0);
  auVar121 = vcmpps_avx(auVar121,auVar122,1);
  auVar132 = vblendvps_avx(ZEXT1632(auVar195),auVar122,auVar121);
  auVar121 = vandps_avx(ZEXT1632(auVar16),local_2c0);
  auVar121 = vcmpps_avx(auVar121,auVar122,1);
  auVar128 = vblendvps_avx(ZEXT1632(auVar16),auVar122,auVar121);
  auVar121 = vandps_avx(ZEXT1632(auVar190),local_2c0);
  auVar121 = vcmpps_avx(auVar121,auVar122,1);
  auVar121 = vblendvps_avx(ZEXT1632(auVar190),auVar122,auVar121);
  auVar195 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar237,auVar229);
  auVar147 = vrcpps_avx(auVar132);
  auVar170._8_4_ = 0x3f800000;
  auVar170._0_8_ = &DAT_3f8000003f800000;
  auVar170._12_4_ = 0x3f800000;
  auVar170._16_4_ = 0x3f800000;
  auVar170._20_4_ = 0x3f800000;
  auVar170._24_4_ = 0x3f800000;
  auVar170._28_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar132,auVar147,auVar170);
  auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar147,auVar147);
  auVar132 = vrcpps_avx(auVar128);
  auVar16 = vfnmadd213ps_fma(auVar128,auVar132,auVar170);
  auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar132,auVar132);
  auVar132 = vrcpps_avx(auVar121);
  auVar190 = vfnmadd213ps_fma(auVar121,auVar132,auVar170);
  auVar190 = vfmadd132ps_fma(ZEXT1632(auVar190),auVar132,auVar132);
  auVar121 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar115 * 7 + 6));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar121 = vsubps_avx(auVar121,ZEXT1632(auVar9));
  auVar147._4_4_ = auVar15._4_4_ * auVar121._4_4_;
  auVar147._0_4_ = auVar15._0_4_ * auVar121._0_4_;
  auVar147._8_4_ = auVar15._8_4_ * auVar121._8_4_;
  auVar147._12_4_ = auVar15._12_4_ * auVar121._12_4_;
  auVar147._16_4_ = auVar121._16_4_ * 0.0;
  auVar147._20_4_ = auVar121._20_4_ * 0.0;
  auVar147._24_4_ = auVar121._24_4_ * 0.0;
  auVar147._28_4_ = auVar121._28_4_;
  auVar121 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar115 * 9 + 6));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar121 = vsubps_avx(auVar121,ZEXT1632(auVar9));
  auVar203._4_4_ = auVar15._4_4_ * auVar121._4_4_;
  auVar203._0_4_ = auVar15._0_4_ * auVar121._0_4_;
  auVar203._8_4_ = auVar15._8_4_ * auVar121._8_4_;
  auVar203._12_4_ = auVar15._12_4_ * auVar121._12_4_;
  auVar203._16_4_ = auVar121._16_4_ * 0.0;
  auVar203._20_4_ = auVar121._20_4_ * 0.0;
  auVar203._24_4_ = auVar121._24_4_ * 0.0;
  auVar203._28_4_ = auVar121._28_4_;
  auVar130._1_3_ = 0;
  auVar130[0] = PVar12;
  auVar132 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar12 * 0x10 + 6));
  auVar121 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar12 * 0x10 + uVar115 * -2 + 6));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar121 = vsubps_avx(auVar121,ZEXT1632(auVar7));
  auVar175._4_4_ = auVar121._4_4_ * auVar16._4_4_;
  auVar175._0_4_ = auVar121._0_4_ * auVar16._0_4_;
  auVar175._8_4_ = auVar121._8_4_ * auVar16._8_4_;
  auVar175._12_4_ = auVar121._12_4_ * auVar16._12_4_;
  auVar175._16_4_ = auVar121._16_4_ * 0.0;
  auVar175._20_4_ = auVar121._20_4_ * 0.0;
  auVar175._24_4_ = auVar121._24_4_ * 0.0;
  auVar175._28_4_ = auVar121._28_4_;
  auVar121 = vcvtdq2ps_avx(auVar132);
  auVar121 = vsubps_avx(auVar121,ZEXT1632(auVar7));
  auVar229._4_4_ = auVar16._4_4_ * auVar121._4_4_;
  auVar229._0_4_ = auVar16._0_4_ * auVar121._0_4_;
  auVar229._8_4_ = auVar16._8_4_ * auVar121._8_4_;
  auVar229._12_4_ = auVar16._12_4_ * auVar121._12_4_;
  auVar229._16_4_ = auVar121._16_4_ * 0.0;
  auVar229._20_4_ = auVar121._20_4_ * 0.0;
  auVar229._24_4_ = auVar121._24_4_ * 0.0;
  auVar229._28_4_ = auVar121._28_4_;
  auVar121 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar109 + uVar115 + 6));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar121 = vsubps_avx(auVar121,ZEXT1632(auVar195));
  auVar18._4_4_ = auVar121._4_4_ * auVar190._4_4_;
  auVar18._0_4_ = auVar121._0_4_ * auVar190._0_4_;
  auVar18._8_4_ = auVar121._8_4_ * auVar190._8_4_;
  auVar18._12_4_ = auVar121._12_4_ * auVar190._12_4_;
  auVar18._16_4_ = auVar121._16_4_ * 0.0;
  auVar18._20_4_ = auVar121._20_4_ * 0.0;
  auVar18._24_4_ = auVar121._24_4_ * 0.0;
  auVar18._28_4_ = auVar121._28_4_;
  auVar121 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar115 * 0x17 + 6));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar121 = vsubps_avx(auVar121,ZEXT1632(auVar195));
  auVar215._4_4_ = auVar190._4_4_ * auVar121._4_4_;
  auVar215._0_4_ = auVar190._0_4_ * auVar121._0_4_;
  auVar215._8_4_ = auVar190._8_4_ * auVar121._8_4_;
  auVar215._12_4_ = auVar190._12_4_ * auVar121._12_4_;
  auVar215._16_4_ = auVar121._16_4_ * 0.0;
  auVar215._20_4_ = auVar121._20_4_ * 0.0;
  auVar215._24_4_ = auVar121._24_4_ * 0.0;
  auVar215._28_4_ = auVar121._28_4_;
  auVar121 = vpminsd_avx2(auVar147,auVar203);
  auVar132 = vpminsd_avx2(auVar175,auVar229);
  auVar121 = vmaxps_avx(auVar121,auVar132);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar213._4_4_ = uVar4;
  auVar213._0_4_ = uVar4;
  auVar213._8_4_ = uVar4;
  auVar213._12_4_ = uVar4;
  auVar213._16_4_ = uVar4;
  auVar213._20_4_ = uVar4;
  auVar213._24_4_ = uVar4;
  auVar213._28_4_ = uVar4;
  auVar132 = vpminsd_avx2(auVar18,auVar215);
  auVar132 = vmaxps_avx(auVar132,auVar213);
  auVar223 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                CONCAT424(0x3f7ffffa,
                                          CONCAT420(0x3f7ffffa,
                                                    CONCAT416(0x3f7ffffa,
                                                              CONCAT412(0x3f7ffffa,
                                                                        CONCAT48(0x3f7ffffa,
                                                                                 0x3f7ffffa3f7ffffa)
                                                                       ))))));
  auVar121 = vmaxps_avx(auVar121,auVar132);
  local_80._4_4_ = auVar121._4_4_ * 0.99999964;
  local_80._0_4_ = auVar121._0_4_ * 0.99999964;
  local_80._8_4_ = auVar121._8_4_ * 0.99999964;
  local_80._12_4_ = auVar121._12_4_ * 0.99999964;
  local_80._16_4_ = auVar121._16_4_ * 0.99999964;
  local_80._20_4_ = auVar121._20_4_ * 0.99999964;
  local_80._24_4_ = auVar121._24_4_ * 0.99999964;
  local_80._28_4_ = auVar132._28_4_;
  auVar121 = vpmaxsd_avx2(auVar147,auVar203);
  auVar132 = vpmaxsd_avx2(auVar175,auVar229);
  auVar121 = vminps_avx(auVar121,auVar132);
  auVar132 = vpmaxsd_avx2(auVar18,auVar215);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar142._4_4_ = uVar4;
  auVar142._0_4_ = uVar4;
  auVar142._8_4_ = uVar4;
  auVar142._12_4_ = uVar4;
  auVar142._16_4_ = uVar4;
  auVar142._20_4_ = uVar4;
  auVar142._24_4_ = uVar4;
  auVar142._28_4_ = uVar4;
  auVar132 = vminps_avx(auVar132,auVar142);
  auVar121 = vminps_avx(auVar121,auVar132);
  auVar17._4_4_ = auVar121._4_4_ * 1.0000004;
  auVar17._0_4_ = auVar121._0_4_ * 1.0000004;
  auVar17._8_4_ = auVar121._8_4_ * 1.0000004;
  auVar17._12_4_ = auVar121._12_4_ * 1.0000004;
  auVar17._16_4_ = auVar121._16_4_ * 1.0000004;
  auVar17._20_4_ = auVar121._20_4_ * 1.0000004;
  auVar17._24_4_ = auVar121._24_4_ * 1.0000004;
  auVar17._28_4_ = auVar121._28_4_;
  auVar130[4] = PVar12;
  auVar130._5_3_ = 0;
  auVar130[8] = PVar12;
  auVar130._9_3_ = 0;
  auVar130[0xc] = PVar12;
  auVar130._13_3_ = 0;
  auVar130[0x10] = PVar12;
  auVar130._17_3_ = 0;
  auVar130[0x14] = PVar12;
  auVar130._21_3_ = 0;
  auVar130[0x18] = PVar12;
  auVar130._25_3_ = 0;
  auVar130[0x1c] = PVar12;
  auVar130._29_3_ = 0;
  auVar132 = vpcmpgtd_avx2(auVar130,_DAT_0205a920);
  auVar121 = vcmpps_avx(local_80,auVar17,2);
  auVar121 = vandps_avx(auVar121,auVar132);
  uVar110 = vmovmskps_avx(auVar121);
  if (uVar110 != 0) {
    uVar110 = uVar110 & 0xff;
    local_620 = mm_lookupmask_ps._16_8_;
    uStack_618 = mm_lookupmask_ps._24_8_;
    uStack_610 = mm_lookupmask_ps._16_8_;
    uStack_608 = mm_lookupmask_ps._24_8_;
    local_728 = (undefined1 (*) [32])&local_1c0;
    iVar107 = 1 << ((uint)k & 0x1f);
    auVar121._4_4_ = iVar107;
    auVar121._0_4_ = iVar107;
    auVar121._8_4_ = iVar107;
    auVar121._12_4_ = iVar107;
    auVar121._16_4_ = iVar107;
    auVar121._20_4_ = iVar107;
    auVar121._24_4_ = iVar107;
    auVar121._28_4_ = iVar107;
    auVar132 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar121 = vpand_avx2(auVar121,auVar132);
    local_2e0 = vpcmpeqd_avx2(auVar121,auVar132);
    local_2f0 = 0x7fffffff;
    uStack_2ec = 0x7fffffff;
    uStack_2e8 = 0x7fffffff;
    uStack_2e4 = 0x7fffffff;
    do {
      auVar121 = local_540;
      auVar132 = auVar223._0_32_;
      auVar128 = auVar224._0_32_;
      lVar19 = 0;
      uVar115 = (ulong)uVar110;
      for (uVar109 = uVar115; (uVar109 & 1) == 0; uVar109 = uVar109 >> 1 | 0x8000000000000000) {
        lVar19 = lVar19 + 1;
      }
      uVar115 = uVar115 - 1 & uVar115;
      uVar4 = *(undefined4 *)(prim + lVar19 * 4 + 6);
      uVar109 = (ulong)(uint)((int)lVar19 << 6);
      uVar110 = *(uint *)(prim + 2);
      pGVar114 = (context->scene->geometries).items[uVar110].ptr;
      pPVar1 = prim + uVar109 + lVar86 + 0x16;
      uVar208 = *(undefined8 *)pPVar1;
      uVar99 = *(undefined8 *)(pPVar1 + 8);
      auVar190 = *(undefined1 (*) [16])pPVar1;
      auVar16 = *(undefined1 (*) [16])pPVar1;
      auVar15 = *(undefined1 (*) [16])pPVar1;
      if (uVar115 != 0) {
        uVar111 = uVar115 - 1 & uVar115;
        for (uVar20 = uVar115; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
        }
        if (uVar111 != 0) {
          for (; (uVar111 & 1) == 0; uVar111 = uVar111 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_740 = *(undefined1 (*) [16])(prim + uVar109 + lVar86 + 0x26);
      local_750 = *(undefined1 (*) [16])(prim + uVar109 + lVar86 + 0x36);
      _local_760 = *(undefined1 (*) [16])(prim + uVar109 + lVar86 + 0x46);
      iVar107 = (int)pGVar114[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar195 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar9 = vinsertps_avx(auVar195,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar7 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar9);
      uVar116 = auVar7._0_4_;
      auVar187._4_4_ = uVar116;
      auVar187._0_4_ = uVar116;
      auVar187._8_4_ = uVar116;
      auVar187._12_4_ = uVar116;
      auVar195 = vshufps_avx(auVar7,auVar7,0x55);
      auVar7 = vshufps_avx(auVar7,auVar7,0xaa);
      aVar5 = pre->ray_space[k].vx.field_0;
      aVar6 = pre->ray_space[k].vy.field_0;
      fVar158 = pre->ray_space[k].vz.field_0.m128[0];
      fVar157 = pre->ray_space[k].vz.field_0.m128[1];
      fVar135 = pre->ray_space[k].vz.field_0.m128[2];
      fVar136 = pre->ray_space[k].vz.field_0.m128[3];
      auVar204._0_4_ = fVar158 * auVar7._0_4_;
      auVar204._4_4_ = fVar157 * auVar7._4_4_;
      auVar204._8_4_ = fVar135 * auVar7._8_4_;
      auVar204._12_4_ = fVar136 * auVar7._12_4_;
      auVar195 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar6,auVar195);
      auVar11 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar5,auVar187);
      auVar195 = vblendps_avx(auVar11,*(undefined1 (*) [16])pPVar1,8);
      auVar8 = vsubps_avx(local_740,auVar9);
      uVar116 = auVar8._0_4_;
      auVar205._4_4_ = uVar116;
      auVar205._0_4_ = uVar116;
      auVar205._8_4_ = uVar116;
      auVar205._12_4_ = uVar116;
      auVar7 = vshufps_avx(auVar8,auVar8,0x55);
      auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
      auVar219._0_4_ = fVar158 * auVar8._0_4_;
      auVar219._4_4_ = fVar157 * auVar8._4_4_;
      auVar219._8_4_ = fVar135 * auVar8._8_4_;
      auVar219._12_4_ = fVar136 * auVar8._12_4_;
      auVar7 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar6,auVar7);
      auVar118 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar5,auVar205);
      auVar7 = vblendps_avx(auVar118,local_740,8);
      auVar10 = vsubps_avx(local_750,auVar9);
      uVar116 = auVar10._0_4_;
      auVar210._4_4_ = uVar116;
      auVar210._0_4_ = uVar116;
      auVar210._8_4_ = uVar116;
      auVar210._12_4_ = uVar116;
      auVar8 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar226._0_4_ = fVar158 * auVar10._0_4_;
      auVar226._4_4_ = fVar157 * auVar10._4_4_;
      auVar226._8_4_ = fVar135 * auVar10._8_4_;
      auVar226._12_4_ = fVar136 * auVar10._12_4_;
      auVar8 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar6,auVar8);
      auVar209 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar5,auVar210);
      auVar8 = vblendps_avx(auVar209,local_750,8);
      auVar10 = vsubps_avx(_local_760,auVar9);
      uVar116 = auVar10._0_4_;
      auVar211._4_4_ = uVar116;
      auVar211._0_4_ = uVar116;
      auVar211._8_4_ = uVar116;
      auVar211._12_4_ = uVar116;
      auVar9 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar228._0_4_ = fVar158 * auVar10._0_4_;
      auVar228._4_4_ = fVar157 * auVar10._4_4_;
      auVar228._8_4_ = fVar135 * auVar10._8_4_;
      auVar228._12_4_ = fVar136 * auVar10._12_4_;
      auVar9 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar6,auVar9);
      auVar187 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar5,auVar211);
      auVar9 = vblendps_avx(auVar187,_local_760,8);
      auVar21._4_4_ = uStack_2ec;
      auVar21._0_4_ = local_2f0;
      auVar21._8_4_ = uStack_2e8;
      auVar21._12_4_ = uStack_2e4;
      auVar195 = vandps_avx(auVar195,auVar21);
      auVar7 = vandps_avx(auVar7,auVar21);
      auVar10 = vmaxps_avx(auVar195,auVar7);
      auVar195 = vandps_avx(auVar8,auVar21);
      auVar7 = vandps_avx(auVar9,auVar21);
      auVar195 = vmaxps_avx(auVar195,auVar7);
      auVar195 = vmaxps_avx(auVar10,auVar195);
      auVar7 = vmovshdup_avx(auVar195);
      auVar7 = vmaxss_avx(auVar7,auVar195);
      auVar195 = vshufpd_avx(auVar195,auVar195,1);
      auVar195 = vmaxss_avx(auVar195,auVar7);
      lVar19 = (long)iVar107 * 0x44;
      auVar7 = vmovshdup_avx(auVar11);
      uVar117 = auVar7._0_8_;
      local_580._8_8_ = uVar117;
      local_580._0_8_ = uVar117;
      local_580._16_8_ = uVar117;
      local_580._24_8_ = uVar117;
      auVar7 = vmovshdup_avx(auVar118);
      uVar117 = auVar7._0_8_;
      local_6e0._8_8_ = uVar117;
      local_6e0._0_8_ = uVar117;
      local_6e0._16_8_ = uVar117;
      local_6e0._24_8_ = uVar117;
      auVar147 = *(undefined1 (*) [32])(bspline_basis0 + lVar19 + 0x908);
      uVar225 = auVar209._0_4_;
      auVar169._4_4_ = uVar225;
      auVar169._0_4_ = uVar225;
      auVar169._8_4_ = uVar225;
      auVar169._12_4_ = uVar225;
      auVar169._16_4_ = uVar225;
      auVar169._20_4_ = uVar225;
      auVar169._24_4_ = uVar225;
      auVar169._28_4_ = uVar225;
      auVar7 = vmovshdup_avx(auVar209);
      uVar117 = auVar7._0_8_;
      auVar206._8_8_ = uVar117;
      auVar206._0_8_ = uVar117;
      auVar206._16_8_ = uVar117;
      auVar206._24_8_ = uVar117;
      fVar158 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar19 + 0xd8c);
      auVar105 = *(undefined1 (*) [28])(bspline_basis0 + lVar19 + 0xd8c);
      local_780 = auVar187._0_4_;
      auVar7 = vmovshdup_avx(auVar187);
      auVar22._4_4_ = local_780 * *(float *)(bspline_basis0 + lVar19 + 0xd90);
      auVar22._0_4_ = local_780 * fVar158;
      auVar22._8_4_ = local_780 * *(float *)(bspline_basis0 + lVar19 + 0xd94);
      auVar22._12_4_ = local_780 * *(float *)(bspline_basis0 + lVar19 + 0xd98);
      auVar22._16_4_ = local_780 * *(float *)(bspline_basis0 + lVar19 + 0xd9c);
      auVar22._20_4_ = local_780 * *(float *)(bspline_basis0 + lVar19 + 0xda0);
      auVar22._24_4_ = local_780 * *(float *)(bspline_basis0 + lVar19 + 0xda4);
      auVar22._28_4_ = *(undefined4 *)(bspline_basis0 + lVar19 + 0xda8);
      auVar8 = vfmadd231ps_fma(auVar22,auVar147,auVar169);
      fVar180 = auVar7._0_4_;
      auVar234._0_4_ = fVar180 * fVar158;
      fVar186 = auVar7._4_4_;
      auVar234._4_4_ = fVar186 * *(float *)(bspline_basis0 + lVar19 + 0xd90);
      auVar234._8_4_ = fVar180 * *(float *)(bspline_basis0 + lVar19 + 0xd94);
      auVar234._12_4_ = fVar186 * *(float *)(bspline_basis0 + lVar19 + 0xd98);
      auVar234._16_4_ = fVar180 * *(float *)(bspline_basis0 + lVar19 + 0xd9c);
      auVar234._20_4_ = fVar186 * *(float *)(bspline_basis0 + lVar19 + 0xda0);
      auVar234._24_4_ = fVar180 * *(float *)(bspline_basis0 + lVar19 + 0xda4);
      auVar234._28_4_ = 0;
      auVar7 = vfmadd231ps_fma(auVar234,auVar147,auVar206);
      auVar203 = *(undefined1 (*) [32])(bspline_basis0 + lVar19 + 0x484);
      uVar116 = auVar118._0_4_;
      local_7a0._4_4_ = uVar116;
      local_7a0._0_4_ = uVar116;
      local_7a0._8_4_ = uVar116;
      local_7a0._12_4_ = uVar116;
      local_7a0._16_4_ = uVar116;
      local_7a0._20_4_ = uVar116;
      local_7a0._24_4_ = uVar116;
      local_7a0._28_4_ = uVar116;
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar203,local_7a0);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar203,local_6e0);
      auVar175 = *(undefined1 (*) [32])(bspline_basis0 + lVar19);
      local_5e0._0_4_ = auVar11._0_4_;
      auVar238._4_4_ = local_5e0._0_4_;
      auVar238._0_4_ = local_5e0._0_4_;
      auVar238._8_4_ = local_5e0._0_4_;
      auVar238._12_4_ = local_5e0._0_4_;
      auVar238._16_4_ = local_5e0._0_4_;
      auVar238._20_4_ = local_5e0._0_4_;
      auVar238._24_4_ = local_5e0._0_4_;
      auVar238._28_4_ = local_5e0._0_4_;
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar175,auVar238);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar175,local_580);
      auVar229 = *(undefined1 (*) [32])(bspline_basis1 + lVar19 + 0x908);
      fVar140 = *(float *)(bspline_basis1 + lVar19 + 0xd8c);
      fVar93 = *(float *)(bspline_basis1 + lVar19 + 0xd90);
      fVar94 = *(float *)(bspline_basis1 + lVar19 + 0xd94);
      fVar95 = *(float *)(bspline_basis1 + lVar19 + 0xd98);
      fVar96 = *(float *)(bspline_basis1 + lVar19 + 0xd9c);
      fVar97 = *(float *)(bspline_basis1 + lVar19 + 0xda0);
      fVar98 = *(float *)(bspline_basis1 + lVar19 + 0xda4);
      auVar23._4_4_ = local_780 * fVar93;
      auVar23._0_4_ = local_780 * fVar140;
      auVar23._8_4_ = local_780 * fVar94;
      auVar23._12_4_ = local_780 * fVar95;
      auVar23._16_4_ = local_780 * fVar96;
      auVar23._20_4_ = local_780 * fVar97;
      auVar23._24_4_ = local_780 * fVar98;
      auVar23._28_4_ = *(undefined4 *)(bspline_basis0 + lVar19 + 0xda8);
      auVar9 = vfmadd231ps_fma(auVar23,auVar229,auVar169);
      auVar24._4_4_ = fVar93 * fVar186;
      auVar24._0_4_ = fVar140 * fVar180;
      auVar24._8_4_ = fVar94 * fVar180;
      auVar24._12_4_ = fVar95 * fVar186;
      auVar24._16_4_ = fVar96 * fVar180;
      auVar24._20_4_ = fVar97 * fVar186;
      auVar24._24_4_ = fVar98 * fVar180;
      auVar24._28_4_ = uVar225;
      auVar10 = vfmadd231ps_fma(auVar24,auVar229,auVar206);
      auVar18 = *(undefined1 (*) [32])(bspline_basis1 + lVar19 + 0x484);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar18,local_7a0);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar18,local_6e0);
      auVar215 = *(undefined1 (*) [32])(bspline_basis1 + lVar19);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar215,auVar238);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar215,local_580);
      auVar122 = ZEXT1632(auVar9);
      auVar142 = ZEXT1632(auVar8);
      auVar17 = vsubps_avx(auVar122,auVar142);
      auVar170 = ZEXT1632(auVar10);
      local_320 = ZEXT1632(auVar7);
      local_340 = vsubps_avx(auVar170,local_320);
      auVar123._0_4_ = auVar7._0_4_ * auVar17._0_4_;
      auVar123._4_4_ = auVar7._4_4_ * auVar17._4_4_;
      auVar123._8_4_ = auVar7._8_4_ * auVar17._8_4_;
      auVar123._12_4_ = auVar7._12_4_ * auVar17._12_4_;
      auVar123._16_4_ = auVar17._16_4_ * 0.0;
      auVar123._20_4_ = auVar17._20_4_ * 0.0;
      auVar123._24_4_ = auVar17._24_4_ * 0.0;
      auVar123._28_4_ = 0;
      fVar158 = local_340._0_4_;
      auVar143._0_4_ = auVar8._0_4_ * fVar158;
      fVar157 = local_340._4_4_;
      auVar143._4_4_ = auVar8._4_4_ * fVar157;
      fVar135 = local_340._8_4_;
      auVar143._8_4_ = auVar8._8_4_ * fVar135;
      fVar136 = local_340._12_4_;
      auVar143._12_4_ = auVar8._12_4_ * fVar136;
      fVar137 = local_340._16_4_;
      auVar143._16_4_ = fVar137 * 0.0;
      fVar138 = local_340._20_4_;
      auVar143._20_4_ = fVar138 * 0.0;
      fVar139 = local_340._24_4_;
      auVar143._24_4_ = fVar139 * 0.0;
      auVar143._28_4_ = 0;
      auVar130 = vsubps_avx(auVar123,auVar143);
      auVar7 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar117 = auVar7._0_8_;
      local_a0._8_8_ = uVar117;
      local_a0._0_8_ = uVar117;
      local_a0._16_8_ = uVar117;
      local_a0._24_8_ = uVar117;
      auVar8 = vpermilps_avx(local_740,0xff);
      uVar117 = auVar8._0_8_;
      local_c0._8_8_ = uVar117;
      local_c0._0_8_ = uVar117;
      local_c0._16_8_ = uVar117;
      local_c0._24_8_ = uVar117;
      auVar8 = vpermilps_avx(local_750,0xff);
      uVar117 = auVar8._0_8_;
      local_e0._8_8_ = uVar117;
      local_e0._0_8_ = uVar117;
      local_e0._16_8_ = uVar117;
      local_e0._24_8_ = uVar117;
      auVar8 = vpermilps_avx(_local_760,0xff);
      local_100 = auVar8._0_8_;
      local_8c0 = auVar105._0_4_;
      fStack_8bc = auVar105._4_4_;
      fStack_8b8 = auVar105._8_4_;
      fStack_8b4 = auVar105._12_4_;
      fStack_8b0 = auVar105._16_4_;
      fStack_8ac = auVar105._20_4_;
      fStack_8a8 = auVar105._24_4_;
      fVar141 = auVar8._0_4_;
      fVar156 = auVar8._4_4_;
      auVar25._4_4_ = fVar156 * fStack_8bc;
      auVar25._0_4_ = fVar141 * local_8c0;
      auVar25._8_4_ = fVar141 * fStack_8b8;
      auVar25._12_4_ = fVar156 * fStack_8b4;
      auVar25._16_4_ = fVar141 * fStack_8b0;
      auVar25._20_4_ = fVar156 * fStack_8ac;
      auVar25._24_4_ = fVar141 * fStack_8a8;
      auVar25._28_4_ = local_5e0._0_4_;
      auVar8 = vfmadd231ps_fma(auVar25,local_e0,auVar147);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar203,local_c0);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar175,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar26._4_4_ = fVar93 * fVar156;
      auVar26._0_4_ = fVar140 * fVar141;
      auVar26._8_4_ = fVar94 * fVar141;
      auVar26._12_4_ = fVar95 * fVar156;
      auVar26._16_4_ = fVar96 * fVar141;
      auVar26._20_4_ = fVar97 * fVar156;
      auVar26._24_4_ = fVar98 * fVar141;
      auVar26._28_4_ = auVar175._28_4_;
      auVar9 = vfmadd231ps_fma(auVar26,auVar229,local_e0);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar18,local_c0);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar215,local_a0);
      auVar27._4_4_ = fVar157 * fVar157;
      auVar27._0_4_ = fVar158 * fVar158;
      auVar27._8_4_ = fVar135 * fVar135;
      auVar27._12_4_ = fVar136 * fVar136;
      auVar27._16_4_ = fVar137 * fVar137;
      auVar27._20_4_ = fVar138 * fVar138;
      auVar27._24_4_ = fVar139 * fVar139;
      auVar27._28_4_ = auVar7._4_4_;
      auVar7 = vfmadd231ps_fma(auVar27,auVar17,auVar17);
      auVar222 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
      auVar28._4_4_ = auVar222._4_4_ * auVar222._4_4_ * auVar7._4_4_;
      auVar28._0_4_ = auVar222._0_4_ * auVar222._0_4_ * auVar7._0_4_;
      auVar28._8_4_ = auVar222._8_4_ * auVar222._8_4_ * auVar7._8_4_;
      auVar28._12_4_ = auVar222._12_4_ * auVar222._12_4_ * auVar7._12_4_;
      auVar28._16_4_ = auVar222._16_4_ * auVar222._16_4_ * 0.0;
      auVar28._20_4_ = auVar222._20_4_ * auVar222._20_4_ * 0.0;
      auVar28._24_4_ = auVar222._24_4_ * auVar222._24_4_ * 0.0;
      auVar28._28_4_ = auVar222._28_4_;
      auVar29._4_4_ = auVar130._4_4_ * auVar130._4_4_;
      auVar29._0_4_ = auVar130._0_4_ * auVar130._0_4_;
      auVar29._8_4_ = auVar130._8_4_ * auVar130._8_4_;
      auVar29._12_4_ = auVar130._12_4_ * auVar130._12_4_;
      auVar29._16_4_ = auVar130._16_4_ * auVar130._16_4_;
      auVar29._20_4_ = auVar130._20_4_ * auVar130._20_4_;
      auVar29._24_4_ = auVar130._24_4_ * auVar130._24_4_;
      auVar29._28_4_ = auVar130._28_4_;
      auVar222 = vcmpps_avx(auVar29,auVar28,2);
      fVar158 = auVar195._0_4_ * 4.7683716e-07;
      auVar124._0_4_ = (float)iVar107;
      local_540._4_12_ = auVar187._4_12_;
      local_540._0_4_ = auVar124._0_4_;
      local_540._16_16_ = auVar121._16_16_;
      auVar124._4_4_ = auVar124._0_4_;
      auVar124._8_4_ = auVar124._0_4_;
      auVar124._12_4_ = auVar124._0_4_;
      auVar124._16_4_ = auVar124._0_4_;
      auVar124._20_4_ = auVar124._0_4_;
      auVar124._24_4_ = auVar124._0_4_;
      auVar124._28_4_ = auVar124._0_4_;
      auVar121 = vcmpps_avx(_DAT_02020f40,auVar124,1);
      auVar7 = vpermilps_avx(auVar11,0xaa);
      uVar117 = auVar7._0_8_;
      local_5e0._8_8_ = uVar117;
      local_5e0._0_8_ = uVar117;
      local_5e0._16_8_ = uVar117;
      local_5e0._24_8_ = uVar117;
      auVar195 = vpermilps_avx(auVar118,0xaa);
      uVar117 = auVar195._0_8_;
      auVar182._8_8_ = uVar117;
      auVar182._0_8_ = uVar117;
      auVar182._16_8_ = uVar117;
      auVar182._24_8_ = uVar117;
      auVar195 = vpermilps_avx(auVar209,0xaa);
      uVar117 = auVar195._0_8_;
      local_520._8_8_ = uVar117;
      local_520._0_8_ = uVar117;
      local_520._16_8_ = uVar117;
      local_520._24_8_ = uVar117;
      auVar195 = vshufps_avx(auVar187,auVar187,0xaa);
      uVar117 = auVar195._0_8_;
      register0x00001508 = uVar117;
      local_6a0 = uVar117;
      register0x00001510 = uVar117;
      register0x00001518 = uVar117;
      auVar130 = auVar121 & auVar222;
      uVar112 = *(uint *)(ray + k * 4 + 0x60);
      _local_700 = ZEXT416(uVar112);
      fStack_77c = local_780;
      fStack_778 = local_780;
      fStack_774 = local_780;
      fStack_770 = local_780;
      fStack_76c = local_780;
      fStack_768 = local_780;
      fStack_764 = local_780;
      if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar130 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar130 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar130 >> 0x7f,0) == '\0') &&
            (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar130 >> 0xbf,0) == '\0') &&
          (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar130[0x1f]) {
        auVar224 = ZEXT3264(auVar128);
        auVar223 = ZEXT3264(auVar132);
        auVar214 = ZEXT3264(CONCAT428(local_780,
                                      CONCAT424(local_780,
                                                CONCAT420(local_780,
                                                          CONCAT416(local_780,
                                                                    CONCAT412(local_780,
                                                                              CONCAT48(local_780,
                                                                                       CONCAT44(
                                                  local_780,local_780))))))));
LAB_018558ae:
        auVar233 = ZEXT3264(_local_6a0);
        auVar218 = ZEXT3264(local_7a0);
      }
      else {
        local_600 = SUB84(pGVar114,0);
        uStack_5fc = (undefined4)((ulong)pGVar114 >> 0x20);
        local_360 = vandps_avx(auVar222,auVar121);
        fVar141 = auVar195._0_4_;
        fVar156 = auVar195._4_4_;
        auVar30._4_4_ = fVar156 * fVar93;
        auVar30._0_4_ = fVar141 * fVar140;
        auVar30._8_4_ = fVar141 * fVar94;
        auVar30._12_4_ = fVar156 * fVar95;
        auVar30._16_4_ = fVar141 * fVar96;
        auVar30._20_4_ = fVar156 * fVar97;
        auVar30._24_4_ = fVar141 * fVar98;
        auVar30._28_4_ = local_360._28_4_;
        auVar195 = vfmadd213ps_fma(auVar229,local_520,auVar30);
        auVar195 = vfmadd213ps_fma(auVar18,auVar182,ZEXT1632(auVar195));
        auVar195 = vfmadd213ps_fma(auVar215,local_5e0,ZEXT1632(auVar195));
        _local_380 = ZEXT1632(auVar195);
        auVar31._4_4_ = fVar156 * fStack_8bc;
        auVar31._0_4_ = fVar141 * local_8c0;
        auVar31._8_4_ = fVar141 * fStack_8b8;
        auVar31._12_4_ = fVar156 * fStack_8b4;
        auVar31._16_4_ = fVar141 * fStack_8b0;
        auVar31._20_4_ = fVar156 * fStack_8ac;
        auVar31._24_4_ = fVar141 * fStack_8a8;
        auVar31._28_4_ = local_360._28_4_;
        auVar195 = vfmadd213ps_fma(auVar147,local_520,auVar31);
        auVar195 = vfmadd213ps_fma(auVar203,auVar182,ZEXT1632(auVar195));
        auVar121 = *(undefined1 (*) [32])(bspline_basis0 + lVar19 + 0x1210);
        auVar147 = *(undefined1 (*) [32])(bspline_basis0 + lVar19 + 0x1694);
        auVar203 = *(undefined1 (*) [32])(bspline_basis0 + lVar19 + 0x1b18);
        fVar157 = *(float *)(bspline_basis0 + lVar19 + 0x1f9c);
        fVar135 = *(float *)(bspline_basis0 + lVar19 + 0x1fa0);
        fVar136 = *(float *)(bspline_basis0 + lVar19 + 0x1fa4);
        fVar137 = *(float *)(bspline_basis0 + lVar19 + 0x1fa8);
        fVar138 = *(float *)(bspline_basis0 + lVar19 + 0x1fac);
        fVar139 = *(float *)(bspline_basis0 + lVar19 + 0x1fb0);
        fVar140 = *(float *)(bspline_basis0 + lVar19 + 0x1fb4);
        auVar199._0_4_ = local_780 * fVar157;
        auVar199._4_4_ = local_780 * fVar135;
        auVar199._8_4_ = local_780 * fVar136;
        auVar199._12_4_ = local_780 * fVar137;
        auVar199._16_4_ = local_780 * fVar138;
        auVar199._20_4_ = local_780 * fVar139;
        auVar199._24_4_ = local_780 * fVar140;
        auVar199._28_4_ = 0;
        auVar32._4_4_ = fVar186 * fVar135;
        auVar32._0_4_ = fVar180 * fVar157;
        auVar32._8_4_ = fVar180 * fVar136;
        auVar32._12_4_ = fVar186 * fVar137;
        auVar32._16_4_ = fVar180 * fVar138;
        auVar32._20_4_ = fVar186 * fVar139;
        auVar32._24_4_ = fVar180 * fVar140;
        auVar32._28_4_ = *(undefined4 *)(bspline_basis1 + lVar19 + 0xda8);
        auVar33._4_4_ = fVar156 * fVar135;
        auVar33._0_4_ = fVar141 * fVar157;
        auVar33._8_4_ = fVar141 * fVar136;
        auVar33._12_4_ = fVar156 * fVar137;
        auVar33._16_4_ = fVar141 * fVar138;
        auVar33._20_4_ = fVar156 * fVar139;
        auVar33._24_4_ = fVar141 * fVar140;
        auVar33._28_4_ = auVar17._28_4_;
        auVar10 = vfmadd231ps_fma(auVar199,auVar203,auVar169);
        auVar11 = vfmadd231ps_fma(auVar32,auVar203,auVar206);
        auVar118 = vfmadd231ps_fma(auVar33,local_520,auVar203);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar147,local_7a0);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar147,local_6e0);
        auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),auVar182,auVar147);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar121,auVar238);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar121,local_580);
        auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),local_5e0,auVar121);
        fVar157 = *(float *)(bspline_basis1 + lVar19 + 0x1f9c);
        fVar135 = *(float *)(bspline_basis1 + lVar19 + 0x1fa0);
        fVar136 = *(float *)(bspline_basis1 + lVar19 + 0x1fa4);
        fVar137 = *(float *)(bspline_basis1 + lVar19 + 0x1fa8);
        fVar138 = *(float *)(bspline_basis1 + lVar19 + 0x1fac);
        fVar139 = *(float *)(bspline_basis1 + lVar19 + 0x1fb0);
        fVar140 = *(float *)(bspline_basis1 + lVar19 + 0x1fb4);
        auVar34._4_4_ = local_780 * fVar135;
        auVar34._0_4_ = local_780 * fVar157;
        auVar34._8_4_ = local_780 * fVar136;
        auVar34._12_4_ = local_780 * fVar137;
        auVar34._16_4_ = local_780 * fVar138;
        auVar34._20_4_ = local_780 * fVar139;
        auVar34._24_4_ = local_780 * fVar140;
        auVar34._28_4_ = local_780;
        auVar35._4_4_ = fVar186 * fVar135;
        auVar35._0_4_ = fVar180 * fVar157;
        auVar35._8_4_ = fVar180 * fVar136;
        auVar35._12_4_ = fVar186 * fVar137;
        auVar35._16_4_ = fVar180 * fVar138;
        auVar35._20_4_ = fVar186 * fVar139;
        auVar35._24_4_ = fVar180 * fVar140;
        auVar35._28_4_ = fVar186;
        auVar36._4_4_ = fVar135 * fVar156;
        auVar36._0_4_ = fVar157 * fVar141;
        auVar36._8_4_ = fVar136 * fVar141;
        auVar36._12_4_ = fVar137 * fVar156;
        auVar36._16_4_ = fVar138 * fVar141;
        auVar36._20_4_ = fVar139 * fVar156;
        auVar36._24_4_ = fVar140 * fVar141;
        auVar36._28_4_ = auVar7._4_4_;
        auVar121 = *(undefined1 (*) [32])(bspline_basis1 + lVar19 + 0x1b18);
        auVar7 = vfmadd231ps_fma(auVar34,auVar121,auVar169);
        auVar209 = vfmadd231ps_fma(auVar35,auVar121,auVar206);
        auVar187 = vfmadd231ps_fma(auVar36,auVar121,local_520);
        auVar121 = *(undefined1 (*) [32])(bspline_basis1 + lVar19 + 0x1694);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar121,local_7a0);
        auVar209 = vfmadd231ps_fma(ZEXT1632(auVar209),auVar121,local_6e0);
        auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar182,auVar121);
        auVar121 = *(undefined1 (*) [32])(bspline_basis1 + lVar19 + 0x1210);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar121,auVar238);
        auVar209 = vfmadd231ps_fma(ZEXT1632(auVar209),auVar121,local_580);
        auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),local_5e0,auVar121);
        auVar121 = vandps_avx(local_2c0,ZEXT1632(auVar10));
        auVar147 = vandps_avx(ZEXT1632(auVar11),local_2c0);
        auVar147 = vmaxps_avx(auVar121,auVar147);
        auVar121 = vandps_avx(ZEXT1632(auVar118),local_2c0);
        auVar121 = vmaxps_avx(auVar147,auVar121);
        auVar144._4_4_ = fVar158;
        auVar144._0_4_ = fVar158;
        auVar144._8_4_ = fVar158;
        auVar144._12_4_ = fVar158;
        auVar144._16_4_ = fVar158;
        auVar144._20_4_ = fVar158;
        auVar144._24_4_ = fVar158;
        auVar144._28_4_ = fVar158;
        auVar121 = vcmpps_avx(auVar121,auVar144,1);
        auVar203 = vblendvps_avx(ZEXT1632(auVar10),auVar17,auVar121);
        auVar229 = vblendvps_avx(ZEXT1632(auVar11),local_340,auVar121);
        auVar121 = vandps_avx(ZEXT1632(auVar7),local_2c0);
        auVar147 = vandps_avx(ZEXT1632(auVar209),local_2c0);
        auVar147 = vmaxps_avx(auVar121,auVar147);
        auVar121 = vandps_avx(ZEXT1632(auVar187),local_2c0);
        auVar121 = vmaxps_avx(auVar147,auVar121);
        auVar147 = vcmpps_avx(auVar121,auVar144,1);
        auVar121 = vblendvps_avx(ZEXT1632(auVar7),auVar17,auVar147);
        auVar147 = vblendvps_avx(ZEXT1632(auVar209),local_340,auVar147);
        auVar195 = vfmadd213ps_fma(auVar175,local_5e0,ZEXT1632(auVar195));
        auVar7 = vfmadd213ps_fma(auVar203,auVar203,ZEXT832(0) << 0x20);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar229,auVar229);
        auVar175 = vrsqrtps_avx(ZEXT1632(auVar7));
        fVar157 = auVar175._0_4_;
        fVar135 = auVar175._4_4_;
        fVar136 = auVar175._8_4_;
        fVar137 = auVar175._12_4_;
        fVar138 = auVar175._16_4_;
        fVar139 = auVar175._20_4_;
        fVar140 = auVar175._24_4_;
        auVar37._4_4_ = fVar135 * fVar135 * fVar135 * auVar7._4_4_ * -0.5;
        auVar37._0_4_ = fVar157 * fVar157 * fVar157 * auVar7._0_4_ * -0.5;
        auVar37._8_4_ = fVar136 * fVar136 * fVar136 * auVar7._8_4_ * -0.5;
        auVar37._12_4_ = fVar137 * fVar137 * fVar137 * auVar7._12_4_ * -0.5;
        auVar37._16_4_ = fVar138 * fVar138 * fVar138 * -0.0;
        auVar37._20_4_ = fVar139 * fVar139 * fVar139 * -0.0;
        auVar37._24_4_ = fVar140 * fVar140 * fVar140 * -0.0;
        auVar37._28_4_ = 0;
        auVar235._8_4_ = 0x3fc00000;
        auVar235._0_8_ = 0x3fc000003fc00000;
        auVar235._12_4_ = 0x3fc00000;
        auVar235._16_4_ = 0x3fc00000;
        auVar235._20_4_ = 0x3fc00000;
        auVar235._24_4_ = 0x3fc00000;
        auVar235._28_4_ = 0x3fc00000;
        auVar7 = vfmadd231ps_fma(auVar37,auVar235,auVar175);
        fVar157 = auVar7._0_4_;
        fVar135 = auVar7._4_4_;
        auVar38._4_4_ = auVar229._4_4_ * fVar135;
        auVar38._0_4_ = auVar229._0_4_ * fVar157;
        fVar136 = auVar7._8_4_;
        auVar38._8_4_ = auVar229._8_4_ * fVar136;
        fVar137 = auVar7._12_4_;
        auVar38._12_4_ = auVar229._12_4_ * fVar137;
        auVar38._16_4_ = auVar229._16_4_ * 0.0;
        auVar38._20_4_ = auVar229._20_4_ * 0.0;
        auVar38._24_4_ = auVar229._24_4_ * 0.0;
        auVar38._28_4_ = auVar175._28_4_;
        auVar39._4_4_ = -auVar203._4_4_ * fVar135;
        auVar39._0_4_ = -auVar203._0_4_ * fVar157;
        auVar39._8_4_ = -auVar203._8_4_ * fVar136;
        auVar39._12_4_ = -auVar203._12_4_ * fVar137;
        auVar39._16_4_ = -auVar203._16_4_ * 0.0;
        auVar39._20_4_ = -auVar203._20_4_ * 0.0;
        auVar39._24_4_ = -auVar203._24_4_ * 0.0;
        auVar39._28_4_ = 0;
        auVar7 = vfmadd213ps_fma(auVar121,auVar121,ZEXT832(0) << 0x20);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar147,auVar147);
        auVar203 = vrsqrtps_avx(ZEXT1632(auVar7));
        auVar175 = ZEXT1632(CONCAT412(fVar137 * 0.0,
                                      CONCAT48(fVar136 * 0.0,CONCAT44(fVar135 * 0.0,fVar157 * 0.0)))
                           );
        fVar157 = auVar203._0_4_;
        fVar135 = auVar203._4_4_;
        fVar136 = auVar203._8_4_;
        fVar137 = auVar203._12_4_;
        fVar138 = auVar203._16_4_;
        fVar139 = auVar203._20_4_;
        fVar140 = auVar203._24_4_;
        auVar40._4_4_ = fVar135 * fVar135 * fVar135 * auVar7._4_4_ * -0.5;
        auVar40._0_4_ = fVar157 * fVar157 * fVar157 * auVar7._0_4_ * -0.5;
        auVar40._8_4_ = fVar136 * fVar136 * fVar136 * auVar7._8_4_ * -0.5;
        auVar40._12_4_ = fVar137 * fVar137 * fVar137 * auVar7._12_4_ * -0.5;
        auVar40._16_4_ = fVar138 * fVar138 * fVar138 * -0.0;
        auVar40._20_4_ = fVar139 * fVar139 * fVar139 * -0.0;
        auVar40._24_4_ = fVar140 * fVar140 * fVar140 * -0.0;
        auVar40._28_4_ = 0xbf000000;
        auVar7 = vfmadd231ps_fma(auVar40,auVar235,auVar203);
        fVar157 = auVar7._0_4_;
        fVar135 = auVar7._4_4_;
        auVar41._4_4_ = fVar135 * auVar147._4_4_;
        auVar41._0_4_ = fVar157 * auVar147._0_4_;
        fVar136 = auVar7._8_4_;
        auVar41._8_4_ = fVar136 * auVar147._8_4_;
        fVar137 = auVar7._12_4_;
        auVar41._12_4_ = fVar137 * auVar147._12_4_;
        auVar41._16_4_ = auVar147._16_4_ * 0.0;
        auVar41._20_4_ = auVar147._20_4_ * 0.0;
        auVar41._24_4_ = auVar147._24_4_ * 0.0;
        auVar41._28_4_ = 0;
        auVar42._4_4_ = fVar135 * -auVar121._4_4_;
        auVar42._0_4_ = fVar157 * -auVar121._0_4_;
        auVar42._8_4_ = fVar136 * -auVar121._8_4_;
        auVar42._12_4_ = fVar137 * -auVar121._12_4_;
        auVar42._16_4_ = -auVar121._16_4_ * 0.0;
        auVar42._20_4_ = -auVar121._20_4_ * 0.0;
        auVar42._24_4_ = -auVar121._24_4_ * 0.0;
        auVar42._28_4_ = 0x3fc00000;
        auVar43._28_4_ = auVar203._28_4_;
        auVar43._0_28_ =
             ZEXT1628(CONCAT412(fVar137 * 0.0,
                                CONCAT48(fVar136 * 0.0,CONCAT44(fVar135 * 0.0,fVar157 * 0.0))));
        auVar7 = vfmadd213ps_fma(auVar38,ZEXT1632(auVar8),auVar142);
        auVar121 = ZEXT1632(auVar8);
        auVar10 = vfmadd213ps_fma(auVar39,auVar121,local_320);
        auVar11 = vfmadd213ps_fma(auVar175,auVar121,ZEXT1632(auVar195));
        auVar21 = vfnmadd213ps_fma(auVar38,auVar121,auVar142);
        auVar118 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar9),auVar122);
        auVar204 = vfnmadd213ps_fma(auVar39,auVar121,local_320);
        auVar121 = ZEXT1632(auVar9);
        auVar209 = vfmadd213ps_fma(auVar42,auVar121,auVar170);
        auVar174 = ZEXT1632(auVar8);
        auVar211 = vfnmadd231ps_fma(ZEXT1632(auVar195),auVar174,auVar175);
        auVar8 = vfmadd213ps_fma(auVar43,auVar121,_local_380);
        auVar205 = vfnmadd213ps_fma(auVar41,auVar121,auVar122);
        auVar210 = vfnmadd213ps_fma(auVar42,auVar121,auVar170);
        auVar219 = vfnmadd231ps_fma(_local_380,ZEXT1632(auVar9),auVar43);
        auVar121 = vsubps_avx(ZEXT1632(auVar209),ZEXT1632(auVar204));
        auVar147 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar211));
        auVar171._0_4_ = auVar211._0_4_ * auVar121._0_4_;
        auVar171._4_4_ = auVar211._4_4_ * auVar121._4_4_;
        auVar171._8_4_ = auVar211._8_4_ * auVar121._8_4_;
        auVar171._12_4_ = auVar211._12_4_ * auVar121._12_4_;
        auVar171._16_4_ = auVar121._16_4_ * 0.0;
        auVar171._20_4_ = auVar121._20_4_ * 0.0;
        auVar171._24_4_ = auVar121._24_4_ * 0.0;
        auVar171._28_4_ = 0;
        auVar187 = vfmsub231ps_fma(auVar171,ZEXT1632(auVar204),auVar147);
        auVar44._4_4_ = auVar21._4_4_ * auVar147._4_4_;
        auVar44._0_4_ = auVar21._0_4_ * auVar147._0_4_;
        auVar44._8_4_ = auVar21._8_4_ * auVar147._8_4_;
        auVar44._12_4_ = auVar21._12_4_ * auVar147._12_4_;
        auVar44._16_4_ = auVar147._16_4_ * 0.0;
        auVar44._20_4_ = auVar147._20_4_ * 0.0;
        auVar44._24_4_ = auVar147._24_4_ * 0.0;
        auVar44._28_4_ = auVar147._28_4_;
        auVar215 = ZEXT1632(auVar21);
        auVar147 = vsubps_avx(ZEXT1632(auVar118),auVar215);
        auVar195 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar211),auVar147);
        auVar45._4_4_ = auVar204._4_4_ * auVar147._4_4_;
        auVar45._0_4_ = auVar204._0_4_ * auVar147._0_4_;
        auVar45._8_4_ = auVar204._8_4_ * auVar147._8_4_;
        auVar45._12_4_ = auVar204._12_4_ * auVar147._12_4_;
        auVar45._16_4_ = auVar147._16_4_ * 0.0;
        auVar45._20_4_ = auVar147._20_4_ * 0.0;
        auVar45._24_4_ = auVar147._24_4_ * 0.0;
        auVar45._28_4_ = auVar147._28_4_;
        auVar21 = vfmsub231ps_fma(auVar45,auVar215,auVar121);
        auVar195 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar195));
        auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),ZEXT832(0) << 0x20,ZEXT1632(auVar187));
        auVar130 = vcmpps_avx(ZEXT1632(auVar195),ZEXT832(0) << 0x20,2);
        auVar121 = vblendvps_avx(ZEXT1632(auVar205),ZEXT1632(auVar7),auVar130);
        auVar147 = vblendvps_avx(ZEXT1632(auVar210),ZEXT1632(auVar10),auVar130);
        auVar203 = vblendvps_avx(ZEXT1632(auVar219),ZEXT1632(auVar11),auVar130);
        auVar175 = vblendvps_avx(auVar215,ZEXT1632(auVar118),auVar130);
        auVar229 = vblendvps_avx(ZEXT1632(auVar204),ZEXT1632(auVar209),auVar130);
        auVar18 = vblendvps_avx(ZEXT1632(auVar211),ZEXT1632(auVar8),auVar130);
        auVar215 = vblendvps_avx(ZEXT1632(auVar118),auVar215,auVar130);
        auVar222 = vblendvps_avx(ZEXT1632(auVar209),ZEXT1632(auVar204),auVar130);
        auVar195 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
        auVar17 = vblendvps_avx(ZEXT1632(auVar8),ZEXT1632(auVar211),auVar130);
        auVar122 = vsubps_avx(auVar215,auVar121);
        auVar222 = vsubps_avx(auVar222,auVar147);
        auVar142 = vsubps_avx(auVar17,auVar203);
        auVar170 = vsubps_avx(auVar121,auVar175);
        auVar212 = vsubps_avx(auVar147,auVar229);
        auVar213 = vsubps_avx(auVar203,auVar18);
        auVar46._4_4_ = auVar142._4_4_ * auVar121._4_4_;
        auVar46._0_4_ = auVar142._0_4_ * auVar121._0_4_;
        auVar46._8_4_ = auVar142._8_4_ * auVar121._8_4_;
        auVar46._12_4_ = auVar142._12_4_ * auVar121._12_4_;
        auVar46._16_4_ = auVar142._16_4_ * auVar121._16_4_;
        auVar46._20_4_ = auVar142._20_4_ * auVar121._20_4_;
        auVar46._24_4_ = auVar142._24_4_ * auVar121._24_4_;
        auVar46._28_4_ = auVar17._28_4_;
        auVar7 = vfmsub231ps_fma(auVar46,auVar203,auVar122);
        auVar47._4_4_ = auVar122._4_4_ * auVar147._4_4_;
        auVar47._0_4_ = auVar122._0_4_ * auVar147._0_4_;
        auVar47._8_4_ = auVar122._8_4_ * auVar147._8_4_;
        auVar47._12_4_ = auVar122._12_4_ * auVar147._12_4_;
        auVar47._16_4_ = auVar122._16_4_ * auVar147._16_4_;
        auVar47._20_4_ = auVar122._20_4_ * auVar147._20_4_;
        auVar47._24_4_ = auVar122._24_4_ * auVar147._24_4_;
        auVar47._28_4_ = auVar215._28_4_;
        auVar8 = vfmsub231ps_fma(auVar47,auVar121,auVar222);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
        auVar125._0_4_ = auVar222._0_4_ * auVar203._0_4_;
        auVar125._4_4_ = auVar222._4_4_ * auVar203._4_4_;
        auVar125._8_4_ = auVar222._8_4_ * auVar203._8_4_;
        auVar125._12_4_ = auVar222._12_4_ * auVar203._12_4_;
        auVar125._16_4_ = auVar222._16_4_ * auVar203._16_4_;
        auVar125._20_4_ = auVar222._20_4_ * auVar203._20_4_;
        auVar125._24_4_ = auVar222._24_4_ * auVar203._24_4_;
        auVar125._28_4_ = 0;
        auVar8 = vfmsub231ps_fma(auVar125,auVar147,auVar142);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
        auVar126._0_4_ = auVar213._0_4_ * auVar175._0_4_;
        auVar126._4_4_ = auVar213._4_4_ * auVar175._4_4_;
        auVar126._8_4_ = auVar213._8_4_ * auVar175._8_4_;
        auVar126._12_4_ = auVar213._12_4_ * auVar175._12_4_;
        auVar126._16_4_ = auVar213._16_4_ * auVar175._16_4_;
        auVar126._20_4_ = auVar213._20_4_ * auVar175._20_4_;
        auVar126._24_4_ = auVar213._24_4_ * auVar175._24_4_;
        auVar126._28_4_ = 0;
        auVar7 = vfmsub231ps_fma(auVar126,auVar170,auVar18);
        auVar48._4_4_ = auVar212._4_4_ * auVar18._4_4_;
        auVar48._0_4_ = auVar212._0_4_ * auVar18._0_4_;
        auVar48._8_4_ = auVar212._8_4_ * auVar18._8_4_;
        auVar48._12_4_ = auVar212._12_4_ * auVar18._12_4_;
        auVar48._16_4_ = auVar212._16_4_ * auVar18._16_4_;
        auVar48._20_4_ = auVar212._20_4_ * auVar18._20_4_;
        auVar48._24_4_ = auVar212._24_4_ * auVar18._24_4_;
        auVar48._28_4_ = auVar18._28_4_;
        auVar10 = vfmsub231ps_fma(auVar48,auVar229,auVar213);
        auVar49._4_4_ = auVar170._4_4_ * auVar229._4_4_;
        auVar49._0_4_ = auVar170._0_4_ * auVar229._0_4_;
        auVar49._8_4_ = auVar170._8_4_ * auVar229._8_4_;
        auVar49._12_4_ = auVar170._12_4_ * auVar229._12_4_;
        auVar49._16_4_ = auVar170._16_4_ * auVar229._16_4_;
        auVar49._20_4_ = auVar170._20_4_ * auVar229._20_4_;
        auVar49._24_4_ = auVar170._24_4_ * auVar229._24_4_;
        auVar49._28_4_ = auVar229._28_4_;
        auVar11 = vfmsub231ps_fma(auVar49,auVar212,auVar175);
        auVar229 = ZEXT832(0) << 0x20;
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar229,ZEXT1632(auVar7));
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar229,ZEXT1632(auVar10));
        auVar175 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar10));
        auVar175 = vcmpps_avx(auVar175,ZEXT832(0) << 0x20,2);
        auVar7 = vpackssdw_avx(auVar175._0_16_,auVar175._16_16_);
        auVar195 = vpand_avx(auVar195,auVar7);
        auVar175 = vpmovsxwd_avx2(auVar195);
        if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar175 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar175 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar175 >> 0x7f,0) == '\0') &&
              (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar175 >> 0xbf,0) == '\0') &&
            (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar175[0x1f]) {
LAB_01857339:
          auVar214 = ZEXT3264(CONCAT824(uStack_608,
                                        CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
          auVar224 = ZEXT3264(auVar128);
          auVar223 = ZEXT3264(auVar132);
        }
        else {
          auVar50._4_4_ = auVar222._4_4_ * auVar213._4_4_;
          auVar50._0_4_ = auVar222._0_4_ * auVar213._0_4_;
          auVar50._8_4_ = auVar222._8_4_ * auVar213._8_4_;
          auVar50._12_4_ = auVar222._12_4_ * auVar213._12_4_;
          auVar50._16_4_ = auVar222._16_4_ * auVar213._16_4_;
          auVar50._20_4_ = auVar222._20_4_ * auVar213._20_4_;
          auVar50._24_4_ = auVar222._24_4_ * auVar213._24_4_;
          auVar50._28_4_ = auVar175._28_4_;
          auVar209 = vfmsub231ps_fma(auVar50,auVar212,auVar142);
          auVar145._0_4_ = auVar170._0_4_ * auVar142._0_4_;
          auVar145._4_4_ = auVar170._4_4_ * auVar142._4_4_;
          auVar145._8_4_ = auVar170._8_4_ * auVar142._8_4_;
          auVar145._12_4_ = auVar170._12_4_ * auVar142._12_4_;
          auVar145._16_4_ = auVar170._16_4_ * auVar142._16_4_;
          auVar145._20_4_ = auVar170._20_4_ * auVar142._20_4_;
          auVar145._24_4_ = auVar170._24_4_ * auVar142._24_4_;
          auVar145._28_4_ = 0;
          auVar118 = vfmsub231ps_fma(auVar145,auVar122,auVar213);
          auVar51._4_4_ = auVar122._4_4_ * auVar212._4_4_;
          auVar51._0_4_ = auVar122._0_4_ * auVar212._0_4_;
          auVar51._8_4_ = auVar122._8_4_ * auVar212._8_4_;
          auVar51._12_4_ = auVar122._12_4_ * auVar212._12_4_;
          auVar51._16_4_ = auVar122._16_4_ * auVar212._16_4_;
          auVar51._20_4_ = auVar122._20_4_ * auVar212._20_4_;
          auVar51._24_4_ = auVar122._24_4_ * auVar212._24_4_;
          auVar51._28_4_ = auVar122._28_4_;
          auVar187 = vfmsub231ps_fma(auVar51,auVar170,auVar222);
          auVar7 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar118),ZEXT1632(auVar187));
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT1632(auVar209),auVar229);
          auVar175 = vrcpps_avx(ZEXT1632(auVar11));
          auVar227._8_4_ = 0x3f800000;
          auVar227._0_8_ = &DAT_3f8000003f800000;
          auVar227._12_4_ = 0x3f800000;
          auVar227._16_4_ = 0x3f800000;
          auVar227._20_4_ = 0x3f800000;
          auVar227._24_4_ = 0x3f800000;
          auVar227._28_4_ = 0x3f800000;
          auVar7 = vfnmadd213ps_fma(auVar175,ZEXT1632(auVar11),auVar227);
          auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar175,auVar175);
          auVar52._4_4_ = auVar187._4_4_ * auVar203._4_4_;
          auVar52._0_4_ = auVar187._0_4_ * auVar203._0_4_;
          auVar52._8_4_ = auVar187._8_4_ * auVar203._8_4_;
          auVar52._12_4_ = auVar187._12_4_ * auVar203._12_4_;
          auVar52._16_4_ = auVar203._16_4_ * 0.0;
          auVar52._20_4_ = auVar203._20_4_ * 0.0;
          auVar52._24_4_ = auVar203._24_4_ * 0.0;
          auVar52._28_4_ = auVar203._28_4_;
          auVar118 = vfmadd231ps_fma(auVar52,auVar147,ZEXT1632(auVar118));
          auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),ZEXT1632(auVar209),auVar121);
          fVar157 = auVar7._0_4_;
          fVar135 = auVar7._4_4_;
          fVar136 = auVar7._8_4_;
          fVar137 = auVar7._12_4_;
          auVar53._28_4_ = auVar147._28_4_;
          auVar53._0_28_ =
               ZEXT1628(CONCAT412(fVar137 * auVar118._12_4_,
                                  CONCAT48(fVar136 * auVar118._8_4_,
                                           CONCAT44(fVar135 * auVar118._4_4_,
                                                    fVar157 * auVar118._0_4_))));
          auVar127._4_4_ = uVar112;
          auVar127._0_4_ = uVar112;
          auVar127._8_4_ = uVar112;
          auVar127._12_4_ = uVar112;
          auVar127._16_4_ = uVar112;
          auVar127._20_4_ = uVar112;
          auVar127._24_4_ = uVar112;
          auVar127._28_4_ = uVar112;
          uVar116 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar146._4_4_ = uVar116;
          auVar146._0_4_ = uVar116;
          auVar146._8_4_ = uVar116;
          auVar146._12_4_ = uVar116;
          auVar146._16_4_ = uVar116;
          auVar146._20_4_ = uVar116;
          auVar146._24_4_ = uVar116;
          auVar146._28_4_ = uVar116;
          auVar121 = vcmpps_avx(auVar127,auVar53,2);
          auVar147 = vcmpps_avx(auVar53,auVar146,2);
          auVar121 = vandps_avx(auVar147,auVar121);
          auVar7 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
          auVar195 = vpand_avx(auVar195,auVar7);
          auVar121 = vpmovsxwd_avx2(auVar195);
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar121 >> 0x7f,0) == '\0') &&
                (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar121 >> 0xbf,0) == '\0') &&
              (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar121[0x1f]) goto LAB_01857339;
          auVar121 = vcmpps_avx(auVar229,ZEXT1632(auVar11),4);
          auVar7 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
          auVar195 = vpand_avx(auVar195,auVar7);
          auVar121 = vpmovsxwd_avx2(auVar195);
          auVar214 = ZEXT3264(CONCAT824(uStack_608,
                                        CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
          auVar224 = ZEXT3264(auVar128);
          auVar223 = ZEXT3264(auVar132);
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0x7f,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0xbf,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar121[0x1f] < '\0') {
            auVar128 = ZEXT1632(CONCAT412(fVar137 * auVar8._12_4_,
                                          CONCAT48(fVar136 * auVar8._8_4_,
                                                   CONCAT44(fVar135 * auVar8._4_4_,
                                                            fVar157 * auVar8._0_4_))));
            auVar147 = ZEXT1632(CONCAT412(fVar137 * auVar10._12_4_,
                                          CONCAT48(fVar136 * auVar10._8_4_,
                                                   CONCAT44(fVar135 * auVar10._4_4_,
                                                            fVar157 * auVar10._0_4_))));
            auVar198._8_4_ = 0x3f800000;
            auVar198._0_8_ = &DAT_3f8000003f800000;
            auVar198._12_4_ = 0x3f800000;
            auVar198._16_4_ = 0x3f800000;
            auVar198._20_4_ = 0x3f800000;
            auVar198._24_4_ = 0x3f800000;
            auVar198._28_4_ = 0x3f800000;
            auVar132 = vsubps_avx(auVar198,auVar128);
            auVar132 = vblendvps_avx(auVar132,auVar128,auVar130);
            auVar224 = ZEXT3264(auVar132);
            auVar132 = vsubps_avx(auVar198,auVar147);
            local_3a0 = vblendvps_avx(auVar132,auVar147,auVar130);
            auVar214 = ZEXT3264(auVar121);
            auVar223 = ZEXT3264(auVar53);
          }
        }
        auVar179 = ZEXT3264(auVar182);
        auVar233 = ZEXT3264(_local_6a0);
        auVar121 = auVar214._0_32_;
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar121 >> 0x7f,0) == '\0') &&
              (auVar214 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar121 >> 0xbf,0) == '\0') &&
            (auVar214 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar214[0x1f]) {
          auVar214 = ZEXT3264(CONCAT428(local_780,
                                        CONCAT424(local_780,
                                                  CONCAT420(local_780,
                                                            CONCAT416(local_780,
                                                                      CONCAT412(local_780,
                                                                                CONCAT48(local_780,
                                                                                         CONCAT44(
                                                  local_780,local_780))))))));
          auVar218 = ZEXT3264(local_7a0);
        }
        else {
          auVar132 = vsubps_avx(ZEXT1632(auVar9),auVar174);
          auVar203 = auVar224._0_32_;
          auVar195 = vfmadd213ps_fma(auVar132,auVar203,auVar174);
          fVar157 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar132._4_4_ = (auVar195._4_4_ + auVar195._4_4_) * fVar157;
          auVar132._0_4_ = (auVar195._0_4_ + auVar195._0_4_) * fVar157;
          auVar132._8_4_ = (auVar195._8_4_ + auVar195._8_4_) * fVar157;
          auVar132._12_4_ = (auVar195._12_4_ + auVar195._12_4_) * fVar157;
          auVar132._16_4_ = fVar157 * 0.0;
          auVar132._20_4_ = fVar157 * 0.0;
          auVar132._24_4_ = fVar157 * 0.0;
          auVar132._28_4_ = 0;
          auVar147 = auVar223._0_32_;
          auVar132 = vcmpps_avx(auVar147,auVar132,6);
          auVar128 = auVar121 & auVar132;
          auVar214 = ZEXT3264(CONCAT428(local_780,
                                        CONCAT424(local_780,
                                                  CONCAT420(local_780,
                                                            CONCAT416(local_780,
                                                                      CONCAT412(local_780,
                                                                                CONCAT48(local_780,
                                                                                         CONCAT44(
                                                  local_780,local_780))))))));
          auVar218 = ZEXT3264(local_7a0);
          if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar128 >> 0x7f,0) == '\0') &&
                (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar128 >> 0xbf,0) == '\0') &&
              (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar128[0x1f]) goto LAB_018558ae;
          local_440 = vandps_avx(auVar132,auVar121);
          auVar148._8_4_ = 0xbf800000;
          auVar148._0_8_ = 0xbf800000bf800000;
          auVar148._12_4_ = 0xbf800000;
          auVar148._16_4_ = 0xbf800000;
          auVar148._20_4_ = 0xbf800000;
          auVar148._24_4_ = 0xbf800000;
          auVar148._28_4_ = 0xbf800000;
          auVar172._8_4_ = 0x40000000;
          auVar172._0_8_ = 0x4000000040000000;
          auVar172._12_4_ = 0x40000000;
          auVar172._16_4_ = 0x40000000;
          auVar172._20_4_ = 0x40000000;
          auVar172._24_4_ = 0x40000000;
          auVar172._28_4_ = 0x40000000;
          auVar195 = vfmadd213ps_fma(local_3a0,auVar172,auVar148);
          local_4e0 = ZEXT1632(auVar195);
          local_3a0 = local_4e0;
          auVar121 = local_3a0;
          local_4a0 = 0;
          local_480 = local_740._0_8_;
          uStack_478 = local_740._8_8_;
          local_470 = local_750._0_8_;
          uStack_468 = local_750._8_8_;
          local_460 = local_760;
          uStack_458 = uStack_758;
          local_3a0 = auVar121;
          if ((pGVar114->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            fVar157 = 1.0 / auVar124._0_4_;
            local_420[0] = fVar157 * (auVar224._0_4_ + 0.0);
            local_420[1] = fVar157 * (auVar224._4_4_ + 1.0);
            local_420[2] = fVar157 * (auVar224._8_4_ + 2.0);
            local_420[3] = fVar157 * (auVar224._12_4_ + 3.0);
            fStack_410 = fVar157 * (auVar224._16_4_ + 4.0);
            fStack_40c = fVar157 * (auVar224._20_4_ + 5.0);
            fStack_408 = fVar157 * (auVar224._24_4_ + 6.0);
            fStack_404 = auVar224._28_4_ + 7.0;
            local_3a0._0_8_ = auVar195._0_8_;
            local_3a0._8_8_ = auVar195._8_8_;
            local_400 = local_3a0._0_8_;
            uStack_3f8 = local_3a0._8_8_;
            uStack_3f0 = 0;
            uStack_3e8 = 0;
            local_3e0 = auVar147;
            auVar149._8_4_ = 0x7f800000;
            auVar149._0_8_ = 0x7f8000007f800000;
            auVar149._12_4_ = 0x7f800000;
            auVar149._16_4_ = 0x7f800000;
            auVar149._20_4_ = 0x7f800000;
            auVar149._24_4_ = 0x7f800000;
            auVar149._28_4_ = 0x7f800000;
            auVar121 = vblendvps_avx(auVar149,auVar147,local_440);
            auVar132 = vshufps_avx(auVar121,auVar121,0xb1);
            auVar132 = vminps_avx(auVar121,auVar132);
            auVar128 = vshufpd_avx(auVar132,auVar132,5);
            auVar132 = vminps_avx(auVar132,auVar128);
            auVar128 = vpermpd_avx2(auVar132,0x4e);
            auVar132 = vminps_avx(auVar132,auVar128);
            auVar132 = vcmpps_avx(auVar121,auVar132,0);
            auVar128 = local_440 & auVar132;
            auVar121 = local_440;
            if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar128 >> 0x7f,0) != '\0') ||
                  (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar128 >> 0xbf,0) != '\0') ||
                (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar128[0x1f] < '\0') {
              auVar121 = vandps_avx(auVar132,local_440);
            }
            uVar108 = vmovmskps_avx(auVar121);
            uVar112 = 0;
            for (; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x80000000) {
              uVar112 = uVar112 + 1;
            }
            uVar109 = (ulong)uVar112;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar114->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar157 = local_420[uVar109];
              uVar116 = *(undefined4 *)((long)&local_400 + uVar109 * 4);
              fVar135 = 1.0 - fVar157;
              auVar190 = ZEXT416((uint)(fVar157 * fVar135 * 4.0));
              auVar195 = vfnmsub213ss_fma(ZEXT416((uint)fVar157),ZEXT416((uint)fVar157),auVar190);
              auVar190 = vfmadd213ss_fma(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135),auVar190);
              fVar135 = fVar135 * -fVar135 * 0.5;
              fVar136 = auVar195._0_4_ * 0.5;
              fVar137 = auVar190._0_4_ * 0.5;
              fVar138 = fVar157 * fVar157 * 0.5;
              auVar188._0_4_ = fVar138 * (float)local_760._0_4_;
              auVar188._4_4_ = fVar138 * (float)local_760._4_4_;
              auVar188._8_4_ = fVar138 * (float)uStack_758;
              auVar188._12_4_ = fVar138 * uStack_758._4_4_;
              auVar159._4_4_ = fVar137;
              auVar159._0_4_ = fVar137;
              auVar159._8_4_ = fVar137;
              auVar159._12_4_ = fVar137;
              auVar190 = vfmadd132ps_fma(auVar159,auVar188,local_750);
              auVar189._4_4_ = fVar136;
              auVar189._0_4_ = fVar136;
              auVar189._8_4_ = fVar136;
              auVar189._12_4_ = fVar136;
              auVar190 = vfmadd132ps_fma(auVar189,auVar190,local_740);
              auVar160._4_4_ = fVar135;
              auVar160._0_4_ = fVar135;
              auVar160._8_4_ = fVar135;
              auVar160._12_4_ = fVar135;
              auVar190 = vfmadd132ps_fma(auVar160,auVar190,*(undefined1 (*) [16])pPVar1);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar109 * 4);
              *(int *)(ray + k * 4 + 0x180) = auVar190._0_4_;
              uVar225 = vextractps_avx(auVar190,1);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar225;
              uVar225 = vextractps_avx(auVar190,2);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar225;
              *(float *)(ray + k * 4 + 0x1e0) = fVar157;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar116;
              *(undefined4 *)(ray + k * 4 + 0x220) = uVar4;
              *(uint *)(ray + k * 4 + 0x240) = uVar110;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            }
            else {
              local_900 = CONCAT44(uVar110,uVar110);
              uStack_8f8._0_4_ = uVar110;
              uStack_8f8._4_4_ = uVar110;
              uStack_8f0._0_4_ = uVar110;
              uStack_8f0._4_4_ = uVar110;
              auVar106 = _local_900;
              uStack_8e8._0_4_ = uVar110;
              uStack_8e8._4_4_ = uVar110;
              auVar121 = _local_900;
              local_720._4_4_ = uVar4;
              local_720._0_4_ = uVar4;
              local_720._8_4_ = uVar4;
              local_720._12_4_ = uVar4;
              local_720._16_4_ = uVar4;
              local_720._20_4_ = uVar4;
              local_720._24_4_ = uVar4;
              local_720._28_4_ = uVar4;
              local_680 = ZEXT1632(local_740);
              local_5a0 = ZEXT1632(local_750);
              _local_5c0 = ZEXT1632(_local_760);
              local_6c0 = auVar182;
              local_660 = local_440;
              local_500 = auVar203;
              local_4c0 = auVar147;
              local_49c = iVar107;
              local_490 = uVar208;
              uStack_488 = uVar99;
              do {
                uVar116 = *(undefined4 *)(ray + k * 4 + 0x100);
                fVar157 = local_420[uVar109];
                auVar120._4_4_ = fVar157;
                auVar120._0_4_ = fVar157;
                auVar120._8_4_ = fVar157;
                auVar120._12_4_ = fVar157;
                local_240._16_4_ = fVar157;
                local_240._0_16_ = auVar120;
                local_240._20_4_ = fVar157;
                local_240._24_4_ = fVar157;
                local_240._28_4_ = fVar157;
                uVar225 = *(undefined4 *)((long)&local_400 + uVar109 * 4);
                local_220._4_4_ = uVar225;
                local_220._0_4_ = uVar225;
                local_220._8_4_ = uVar225;
                local_220._12_4_ = uVar225;
                local_220._16_4_ = uVar225;
                local_220._20_4_ = uVar225;
                local_220._24_4_ = uVar225;
                local_220._28_4_ = uVar225;
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar109 * 4);
                fVar136 = 1.0 - fVar157;
                auVar195 = ZEXT416((uint)(fVar157 * fVar136 * 4.0));
                auVar7 = vfnmsub213ss_fma(auVar120,auVar120,auVar195);
                auVar195 = vfmadd213ss_fma(ZEXT416((uint)fVar136),ZEXT416((uint)fVar136),auVar195);
                fVar135 = auVar195._0_4_ * 0.5;
                fVar157 = fVar157 * fVar157 * 0.5;
                auVar196._0_4_ = fVar157 * (float)local_5c0._0_4_;
                auVar196._4_4_ = fVar157 * (float)local_5c0._4_4_;
                auVar196._8_4_ = fVar157 * fStack_5b8;
                auVar196._12_4_ = fVar157 * fStack_5b4;
                auVar166._4_4_ = fVar135;
                auVar166._0_4_ = fVar135;
                auVar166._8_4_ = fVar135;
                auVar166._12_4_ = fVar135;
                auVar195 = vfmadd132ps_fma(auVar166,auVar196,local_5a0._0_16_);
                fVar157 = auVar7._0_4_ * 0.5;
                auVar197._4_4_ = fVar157;
                auVar197._0_4_ = fVar157;
                auVar197._8_4_ = fVar157;
                auVar197._12_4_ = fVar157;
                auVar195 = vfmadd132ps_fma(auVar197,auVar195,local_680._0_16_);
                local_7d0.context = context->user;
                fVar157 = fVar136 * -fVar136 * 0.5;
                auVar167._4_4_ = fVar157;
                auVar167._0_4_ = fVar157;
                auVar167._8_4_ = fVar157;
                auVar167._12_4_ = fVar157;
                auVar7 = vfmadd132ps_fma(auVar167,auVar195,auVar190);
                local_2a0 = auVar7._0_4_;
                uStack_29c = local_2a0;
                uStack_298 = local_2a0;
                uStack_294 = local_2a0;
                uStack_290 = local_2a0;
                uStack_28c = local_2a0;
                uStack_288 = local_2a0;
                uStack_284 = local_2a0;
                auVar195 = vmovshdup_avx(auVar7);
                local_280._8_8_ = auVar195._0_8_;
                local_280._0_8_ = local_280._8_8_;
                local_280._16_8_ = local_280._8_8_;
                local_280._24_8_ = local_280._8_8_;
                auVar195 = vshufps_avx(auVar7,auVar7,0xaa);
                auVar168._0_8_ = auVar195._0_8_;
                auVar168._8_8_ = auVar168._0_8_;
                auVar178._16_8_ = auVar168._0_8_;
                auVar178._0_16_ = auVar168;
                auVar178._24_8_ = auVar168._0_8_;
                local_260 = auVar178;
                local_200 = local_720._0_8_;
                uStack_1f8 = local_720._8_8_;
                uStack_1f0 = local_720._16_8_;
                uStack_1e8 = local_720._24_8_;
                uStack_8f0 = auVar106._16_8_;
                uStack_8e8 = auVar121._24_8_;
                local_1e0 = local_900;
                uStack_1d8 = uStack_8f8;
                uStack_1d0 = uStack_8f0;
                uStack_1c8 = uStack_8e8;
                auVar132 = vpcmpeqd_avx2(local_220,local_220);
                local_728[1] = auVar132;
                *local_728 = auVar132;
                local_1c0 = (local_7d0.context)->instID[0];
                uStack_1bc = local_1c0;
                uStack_1b8 = local_1c0;
                uStack_1b4 = local_1c0;
                uStack_1b0 = local_1c0;
                uStack_1ac = local_1c0;
                uStack_1a8 = local_1c0;
                uStack_1a4 = local_1c0;
                local_1a0 = (local_7d0.context)->instPrimID[0];
                uStack_19c = local_1a0;
                uStack_198 = local_1a0;
                uStack_194 = local_1a0;
                uStack_190 = local_1a0;
                uStack_18c = local_1a0;
                uStack_188 = local_1a0;
                uStack_184 = local_1a0;
                local_640 = local_2e0._0_8_;
                uStack_638 = local_2e0._8_8_;
                uStack_630 = local_2e0._16_8_;
                uStack_628 = local_2e0._24_8_;
                local_7d0.valid = (int *)&local_640;
                local_7d0.geometryUserPtr = *(void **)(CONCAT44(uStack_5fc,local_600) + 0x18);
                local_7d0.hit = (RTCHitN *)&local_2a0;
                local_7d0.N = 8;
                pcVar14 = *(code **)(CONCAT44(uStack_5fc,local_600) + 0x40);
                local_7d0.ray = (RTCRayN *)ray;
                if (pcVar14 != (code *)0x0) {
                  auVar178 = ZEXT1632(auVar168);
                  (*pcVar14)(&local_7d0);
                  auVar134._8_56_ = extraout_var_00;
                  auVar134._0_8_ = extraout_XMM1_Qa_00;
                  auVar233 = ZEXT3264(_local_6a0);
                  auVar179 = ZEXT3264(local_6c0);
                  auVar218 = ZEXT3264(local_7a0);
                  auVar214 = ZEXT3264(CONCAT428(fStack_764,
                                                CONCAT424(fStack_768,
                                                          CONCAT420(fStack_76c,
                                                                    CONCAT416(fStack_770,
                                                                              CONCAT412(fStack_774,
                                                                                        CONCAT48(
                                                  fStack_778,CONCAT44(fStack_77c,local_780))))))));
                  auVar223 = ZEXT3264(auVar147);
                  auVar224 = ZEXT3264(auVar203);
                  auVar132 = vpcmpeqd_avx2(auVar134._0_32_,auVar134._0_32_);
                }
                auVar102._8_8_ = uStack_638;
                auVar102._0_8_ = local_640;
                auVar102._16_8_ = uStack_630;
                auVar102._24_8_ = uStack_628;
                auVar175 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar102);
                auVar128 = auVar132 & ~auVar175;
                if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar128 >> 0x7f,0) == '\0') &&
                      (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar128 >> 0xbf,0) == '\0') &&
                    (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar128[0x1f]) {
                  auVar134 = ZEXT3264(auVar175 ^ auVar132);
                }
                else {
                  p_Var13 = context->args->filter;
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(CONCAT44(uStack_5fc,local_600) + 0x3e) & 0x40) != 0)))) {
                    auVar178 = ZEXT1632(auVar178._0_16_);
                    (*p_Var13)(&local_7d0);
                    auVar233 = ZEXT3264(_local_6a0);
                    auVar179 = ZEXT3264(local_6c0);
                    auVar218 = ZEXT3264(local_7a0);
                    auVar214 = ZEXT3264(CONCAT428(fStack_764,
                                                  CONCAT424(fStack_768,
                                                            CONCAT420(fStack_76c,
                                                                      CONCAT416(fStack_770,
                                                                                CONCAT412(fStack_774
                                                                                          ,CONCAT48(
                                                  fStack_778,CONCAT44(fStack_77c,local_780))))))));
                    auVar223 = ZEXT3264(auVar147);
                    auVar224 = ZEXT3264(auVar203);
                  }
                  auVar103._8_8_ = uStack_638;
                  auVar103._0_8_ = local_640;
                  auVar103._16_8_ = uStack_630;
                  auVar103._24_8_ = uStack_628;
                  auVar128 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar103);
                  auVar175 = vpcmpeqd_avx2(auVar178,auVar178);
                  auVar134 = ZEXT3264(auVar128 ^ auVar175);
                  auVar132 = auVar175 & ~auVar128;
                  if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar132 >> 0x7f,0) != '\0') ||
                        (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar132 >> 0xbf,0) != '\0') ||
                      (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar132[0x1f] < '\0') {
                    auVar153._0_4_ = auVar128._0_4_ ^ auVar175._0_4_;
                    auVar153._4_4_ = auVar128._4_4_ ^ auVar175._4_4_;
                    auVar153._8_4_ = auVar128._8_4_ ^ auVar175._8_4_;
                    auVar153._12_4_ = auVar128._12_4_ ^ auVar175._12_4_;
                    auVar153._16_4_ = auVar128._16_4_ ^ auVar175._16_4_;
                    auVar153._20_4_ = auVar128._20_4_ ^ auVar175._20_4_;
                    auVar153._24_4_ = auVar128._24_4_ ^ auVar175._24_4_;
                    auVar153._28_4_ = auVar128._28_4_ ^ auVar175._28_4_;
                    auVar132 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])local_7d0.hit);
                    *(undefined1 (*) [32])(local_7d0.ray + 0x180) = auVar132;
                    auVar132 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])(local_7d0.hit + 0x20))
                    ;
                    *(undefined1 (*) [32])(local_7d0.ray + 0x1a0) = auVar132;
                    auVar132 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])(local_7d0.hit + 0x40))
                    ;
                    *(undefined1 (*) [32])(local_7d0.ray + 0x1c0) = auVar132;
                    auVar132 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])(local_7d0.hit + 0x60))
                    ;
                    *(undefined1 (*) [32])(local_7d0.ray + 0x1e0) = auVar132;
                    auVar132 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])(local_7d0.hit + 0x80))
                    ;
                    *(undefined1 (*) [32])(local_7d0.ray + 0x200) = auVar132;
                    auVar132 = vpmaskmovd_avx2(auVar153,*(undefined1 (*) [32])(local_7d0.hit + 0xa0)
                                              );
                    *(undefined1 (*) [32])(local_7d0.ray + 0x220) = auVar132;
                    auVar132 = vpmaskmovd_avx2(auVar153,*(undefined1 (*) [32])(local_7d0.hit + 0xc0)
                                              );
                    *(undefined1 (*) [32])(local_7d0.ray + 0x240) = auVar132;
                    auVar132 = vpmaskmovd_avx2(auVar153,*(undefined1 (*) [32])(local_7d0.hit + 0xe0)
                                              );
                    *(undefined1 (*) [32])(local_7d0.ray + 0x260) = auVar132;
                    auVar132 = vpmaskmovd_avx2(auVar153,*(undefined1 (*) [32])
                                                         (local_7d0.hit + 0x100));
                    *(undefined1 (*) [32])(local_7d0.ray + 0x280) = auVar132;
                  }
                }
                auVar182 = auVar179._0_32_;
                auVar132 = auVar134._0_32_;
                if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar132 >> 0x7f,0) == '\0') &&
                      (auVar134 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                     SUB321(auVar132 >> 0xbf,0) == '\0') &&
                    (auVar134 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                    -1 < auVar134[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar116;
                }
                *(undefined4 *)(local_660 + uVar109 * 4) = 0;
                uVar116 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar133._4_4_ = uVar116;
                auVar133._0_4_ = uVar116;
                auVar133._8_4_ = uVar116;
                auVar133._12_4_ = uVar116;
                auVar133._16_4_ = uVar116;
                auVar133._20_4_ = uVar116;
                auVar133._24_4_ = uVar116;
                auVar133._28_4_ = uVar116;
                auVar128 = vcmpps_avx(auVar223._0_32_,auVar133,2);
                auVar132 = vandps_avx(auVar128,local_660);
                local_660 = local_660 & auVar128;
                bVar91 = (local_660 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                bVar92 = (local_660 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                bVar90 = (local_660 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                bVar89 = SUB321(local_660 >> 0x7f,0) != '\0';
                bVar88 = (local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                bVar87 = SUB321(local_660 >> 0xbf,0) != '\0';
                bVar85 = (local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                bVar83 = local_660[0x1f] < '\0';
                if (((((((bVar91 || bVar92) || bVar90) || bVar89) || bVar88) || bVar87) || bVar85)
                    || bVar83) {
                  auVar154._8_4_ = 0x7f800000;
                  auVar154._0_8_ = 0x7f8000007f800000;
                  auVar154._12_4_ = 0x7f800000;
                  auVar154._16_4_ = 0x7f800000;
                  auVar154._20_4_ = 0x7f800000;
                  auVar154._24_4_ = 0x7f800000;
                  auVar154._28_4_ = 0x7f800000;
                  auVar128 = vblendvps_avx(auVar154,auVar223._0_32_,auVar132);
                  auVar175 = vshufps_avx(auVar128,auVar128,0xb1);
                  auVar175 = vminps_avx(auVar128,auVar175);
                  auVar229 = vshufpd_avx(auVar175,auVar175,5);
                  auVar175 = vminps_avx(auVar175,auVar229);
                  auVar229 = vpermpd_avx2(auVar175,0x4e);
                  auVar175 = vminps_avx(auVar175,auVar229);
                  auVar175 = vcmpps_avx(auVar128,auVar175,0);
                  auVar229 = auVar132 & auVar175;
                  auVar128 = auVar132;
                  if ((((((((auVar229 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar229 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar229 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar229 >> 0x7f,0) != '\0') ||
                        (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar229 >> 0xbf,0) != '\0') ||
                      (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar229[0x1f] < '\0') {
                    auVar128 = vandps_avx(auVar175,auVar132);
                  }
                  uVar108 = vmovmskps_avx(auVar128);
                  uVar112 = 0;
                  for (; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x80000000) {
                    uVar112 = uVar112 + 1;
                  }
                  uVar109 = (ulong)uVar112;
                }
                local_660 = auVar132;
              } while (((((((bVar91 || bVar92) || bVar90) || bVar89) || bVar88) || bVar87) || bVar85
                       ) || bVar83);
            }
          }
        }
      }
      auVar179 = ZEXT464((uint)fVar158);
      if (8 < iVar107) {
        _local_6a0 = auVar233._0_32_;
        local_360._4_4_ = iVar107;
        local_360._0_4_ = iVar107;
        local_360._8_4_ = iVar107;
        local_360._12_4_ = iVar107;
        local_360._16_4_ = iVar107;
        local_360._20_4_ = iVar107;
        local_360._24_4_ = iVar107;
        local_360._28_4_ = iVar107;
        local_380._4_4_ = fVar158;
        local_380._0_4_ = fVar158;
        fStack_378 = fVar158;
        fStack_374 = fVar158;
        fStack_370 = fVar158;
        fStack_36c = fVar158;
        fStack_368 = fVar158;
        fStack_364 = fVar158;
        local_600 = local_700._0_4_;
        uStack_5fc = local_700._0_4_;
        uStack_5f8 = local_700._0_4_;
        uStack_5f4 = local_700._0_4_;
        uStack_5f0 = local_700._0_4_;
        uStack_5ec = local_700._0_4_;
        uStack_5e8 = local_700._0_4_;
        uStack_5e4 = local_700._0_4_;
        local_140 = 1.0 / (float)local_540._0_4_;
        fStack_13c = local_140;
        fStack_138 = local_140;
        fStack_134 = local_140;
        fStack_130 = local_140;
        fStack_12c = local_140;
        fStack_128 = local_140;
        fStack_124 = local_140;
        local_160 = uVar110;
        uStack_15c = uVar110;
        uStack_158 = uVar110;
        uStack_154 = uVar110;
        uStack_150 = uVar110;
        uStack_14c = uVar110;
        uStack_148 = uVar110;
        uStack_144 = uVar110;
        local_180 = uVar4;
        uStack_17c = uVar4;
        uStack_178 = uVar4;
        uStack_174 = uVar4;
        uStack_170 = uVar4;
        uStack_16c = uVar4;
        uStack_168 = uVar4;
        uStack_164 = uVar4;
        lVar113 = 8;
        auVar132 = auVar224._0_32_;
        auVar121 = auVar223._0_32_;
        local_6c0 = auVar182;
        do {
          auVar10 = local_740;
          auVar9 = local_750;
          auVar128 = *(undefined1 (*) [32])(bspline_basis0 + lVar113 * 4 + lVar19);
          auVar147 = *(undefined1 (*) [32])(lVar19 + 0x222bfac + lVar113 * 4);
          auVar203 = *(undefined1 (*) [32])(lVar19 + 0x222c430 + lVar113 * 4);
          pauVar2 = (undefined1 (*) [28])(lVar19 + 0x222c8b4 + lVar113 * 4);
          auVar105 = *pauVar2;
          auVar232._0_4_ = auVar214._0_4_ * *(float *)*pauVar2;
          auVar232._4_4_ = auVar214._4_4_ * *(float *)(*pauVar2 + 4);
          auVar232._8_4_ = auVar214._8_4_ * *(float *)(*pauVar2 + 8);
          auVar232._12_4_ = auVar214._12_4_ * *(float *)(*pauVar2 + 0xc);
          auVar232._16_4_ = auVar214._16_4_ * *(float *)(*pauVar2 + 0x10);
          auVar232._20_4_ = auVar214._20_4_ * *(float *)(*pauVar2 + 0x14);
          auVar232._28_36_ = auVar233._28_36_;
          auVar232._24_4_ = auVar214._24_4_ * *(float *)(*pauVar2 + 0x18);
          auVar233._0_4_ = fVar180 * *(float *)*pauVar2;
          auVar233._4_4_ = fVar186 * *(float *)(*pauVar2 + 4);
          auVar233._8_4_ = fVar180 * *(float *)(*pauVar2 + 8);
          auVar233._12_4_ = fVar186 * *(float *)(*pauVar2 + 0xc);
          auVar233._16_4_ = fVar180 * *(float *)(*pauVar2 + 0x10);
          auVar233._20_4_ = fVar186 * *(float *)(*pauVar2 + 0x14);
          auVar233._28_36_ = auVar179._28_36_;
          auVar233._24_4_ = fVar180 * *(float *)(*pauVar2 + 0x18);
          auVar190 = vfmadd231ps_fma(auVar232._0_32_,auVar203,auVar169);
          auVar195 = vfmadd231ps_fma(auVar233._0_32_,auVar203,auVar206);
          auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar147,auVar218._0_32_);
          auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar147,local_6e0);
          auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar128,auVar238);
          auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar128,local_580);
          auVar130 = *(undefined1 (*) [32])(bspline_basis1 + lVar113 * 4 + lVar19);
          auVar175 = *(undefined1 (*) [32])(lVar19 + 0x222e3cc + lVar113 * 4);
          auVar229 = *(undefined1 (*) [32])(lVar19 + 0x222e850 + lVar113 * 4);
          pfVar3 = (float *)(lVar19 + 0x222ecd4 + lVar113 * 4);
          fVar140 = *pfVar3;
          fVar93 = pfVar3[1];
          fVar94 = pfVar3[2];
          fVar95 = pfVar3[3];
          fVar96 = pfVar3[4];
          fVar97 = pfVar3[5];
          fVar98 = pfVar3[6];
          auVar54._4_4_ = auVar214._4_4_ * fVar93;
          auVar54._0_4_ = auVar214._0_4_ * fVar140;
          auVar54._8_4_ = auVar214._8_4_ * fVar94;
          auVar54._12_4_ = auVar214._12_4_ * fVar95;
          auVar54._16_4_ = auVar214._16_4_ * fVar96;
          auVar54._20_4_ = auVar214._20_4_ * fVar97;
          auVar54._24_4_ = auVar214._24_4_ * fVar98;
          auVar54._28_4_ = local_580._28_4_;
          auVar179._0_4_ = fVar180 * fVar140;
          auVar179._4_4_ = fVar186 * fVar93;
          auVar179._8_4_ = fVar180 * fVar94;
          auVar179._12_4_ = fVar186 * fVar95;
          auVar179._16_4_ = fVar180 * fVar96;
          auVar179._20_4_ = fVar186 * fVar97;
          auVar179._28_36_ = auVar214._28_36_;
          auVar179._24_4_ = fVar180 * fVar98;
          auVar7 = vfmadd231ps_fma(auVar54,auVar229,auVar169);
          auVar8 = vfmadd231ps_fma(auVar179._0_32_,auVar229,auVar206);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar175,auVar218._0_32_);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar175,local_6e0);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar130,auVar238);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar130,local_580);
          _local_5c0 = ZEXT1632(auVar7);
          local_320 = ZEXT1632(auVar190);
          auVar215 = vsubps_avx(_local_5c0,local_320);
          local_5a0 = ZEXT1632(auVar8);
          auVar122 = ZEXT1632(auVar195);
          local_340 = vsubps_avx(local_5a0,auVar122);
          auVar55._4_4_ = auVar195._4_4_ * auVar215._4_4_;
          auVar55._0_4_ = auVar195._0_4_ * auVar215._0_4_;
          auVar55._8_4_ = auVar195._8_4_ * auVar215._8_4_;
          auVar55._12_4_ = auVar195._12_4_ * auVar215._12_4_;
          auVar55._16_4_ = auVar215._16_4_ * 0.0;
          auVar55._20_4_ = auVar215._20_4_ * 0.0;
          auVar55._24_4_ = auVar215._24_4_ * 0.0;
          auVar55._28_4_ = local_580._28_4_;
          fVar158 = local_340._0_4_;
          fVar157 = local_340._4_4_;
          auVar84._4_4_ = auVar190._4_4_ * fVar157;
          auVar84._0_4_ = auVar190._0_4_ * fVar158;
          fVar135 = local_340._8_4_;
          auVar84._8_4_ = auVar190._8_4_ * fVar135;
          fVar136 = local_340._12_4_;
          auVar84._12_4_ = auVar190._12_4_ * fVar136;
          fVar137 = local_340._16_4_;
          auVar84._16_4_ = fVar137 * 0.0;
          fVar138 = local_340._20_4_;
          auVar84._20_4_ = fVar138 * 0.0;
          fVar139 = local_340._24_4_;
          auVar84._24_4_ = fVar139 * 0.0;
          auVar84._28_4_ = local_6e0._28_4_;
          auVar233 = ZEXT3264(auVar203);
          auVar222 = vsubps_avx(auVar55,auVar84);
          local_8c0 = auVar105._0_4_;
          fStack_8bc = auVar105._4_4_;
          fStack_8b8 = auVar105._8_4_;
          fStack_8b4 = auVar105._12_4_;
          fStack_8b0 = auVar105._16_4_;
          fStack_8ac = auVar105._20_4_;
          fStack_8a8 = auVar105._24_4_;
          auVar173._0_4_ = (float)local_100 * local_8c0;
          auVar173._4_4_ = local_100._4_4_ * fStack_8bc;
          auVar173._8_4_ = (float)uStack_f8 * fStack_8b8;
          auVar173._12_4_ = uStack_f8._4_4_ * fStack_8b4;
          auVar173._16_4_ = (float)uStack_f0 * fStack_8b0;
          auVar173._20_4_ = uStack_f0._4_4_ * fStack_8ac;
          auVar173._24_4_ = (float)uStack_e8 * fStack_8a8;
          auVar173._28_4_ = 0;
          auVar190 = vfmadd231ps_fma(auVar173,auVar203,local_e0);
          auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar147,local_c0);
          auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),local_a0,auVar128);
          auVar179 = ZEXT1664(auVar190);
          auVar56._4_4_ = local_100._4_4_ * fVar93;
          auVar56._0_4_ = (float)local_100 * fVar140;
          auVar56._8_4_ = (float)uStack_f8 * fVar94;
          auVar56._12_4_ = uStack_f8._4_4_ * fVar95;
          auVar56._16_4_ = (float)uStack_f0 * fVar96;
          auVar56._20_4_ = uStack_f0._4_4_ * fVar97;
          auVar56._24_4_ = (float)uStack_e8 * fVar98;
          auVar56._28_4_ = uStack_e8._4_4_;
          auVar7 = vfmadd231ps_fma(auVar56,auVar229,local_e0);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar175,local_c0);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar130,local_a0);
          auVar57._4_4_ = fVar157 * fVar157;
          auVar57._0_4_ = fVar158 * fVar158;
          auVar57._8_4_ = fVar135 * fVar135;
          auVar57._12_4_ = fVar136 * fVar136;
          auVar57._16_4_ = fVar137 * fVar137;
          auVar57._20_4_ = fVar138 * fVar138;
          auVar57._24_4_ = fVar139 * fVar139;
          auVar57._28_4_ = local_a0._28_4_;
          auVar8 = vfmadd231ps_fma(auVar57,auVar215,auVar215);
          _local_700 = ZEXT1632(auVar7);
          auVar18 = vmaxps_avx(ZEXT1632(auVar190),_local_700);
          auVar220._0_4_ = auVar18._0_4_ * auVar18._0_4_ * auVar8._0_4_;
          auVar220._4_4_ = auVar18._4_4_ * auVar18._4_4_ * auVar8._4_4_;
          auVar220._8_4_ = auVar18._8_4_ * auVar18._8_4_ * auVar8._8_4_;
          auVar220._12_4_ = auVar18._12_4_ * auVar18._12_4_ * auVar8._12_4_;
          auVar220._16_4_ = auVar18._16_4_ * auVar18._16_4_ * 0.0;
          auVar220._20_4_ = auVar18._20_4_ * auVar18._20_4_ * 0.0;
          auVar220._24_4_ = auVar18._24_4_ * auVar18._24_4_ * 0.0;
          auVar220._28_4_ = 0;
          auVar58._4_4_ = auVar222._4_4_ * auVar222._4_4_;
          auVar58._0_4_ = auVar222._0_4_ * auVar222._0_4_;
          auVar58._8_4_ = auVar222._8_4_ * auVar222._8_4_;
          auVar58._12_4_ = auVar222._12_4_ * auVar222._12_4_;
          auVar58._16_4_ = auVar222._16_4_ * auVar222._16_4_;
          auVar58._20_4_ = auVar222._20_4_ * auVar222._20_4_;
          auVar58._24_4_ = auVar222._24_4_ * auVar222._24_4_;
          auVar58._28_4_ = pfVar3[7];
          auVar18 = vcmpps_avx(auVar58,auVar220,2);
          local_4a0 = (int)lVar113;
          auVar221._4_4_ = local_4a0;
          auVar221._0_4_ = local_4a0;
          auVar221._8_4_ = local_4a0;
          auVar221._12_4_ = local_4a0;
          auVar221._16_4_ = local_4a0;
          auVar221._20_4_ = local_4a0;
          auVar221._24_4_ = local_4a0;
          auVar221._28_4_ = local_4a0;
          auVar222 = vpor_avx2(auVar221,_DAT_0205a920);
          auVar17 = vpcmpgtd_avx2(local_360,auVar222);
          auVar222 = auVar17 & auVar18;
          if ((((((((auVar222 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar222 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar222 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar222 >> 0x7f,0) == '\0') &&
                (auVar222 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar222 >> 0xbf,0) == '\0') &&
              (auVar222 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar222[0x1f]) {
LAB_01856aa7:
            _local_700 = auVar203;
            auVar214 = ZEXT3264(CONCAT428(fStack_764,
                                          CONCAT424(fStack_768,
                                                    CONCAT420(fStack_76c,
                                                              CONCAT416(fStack_770,
                                                                        CONCAT412(fStack_774,
                                                                                  CONCAT48(
                                                  fStack_778,CONCAT44(fStack_77c,local_780))))))));
            auVar218 = ZEXT3264(local_7a0);
          }
          else {
            local_540 = vandps_avx(auVar17,auVar18);
            auVar59._4_4_ = (float)local_6a0._4_4_ * fVar93;
            auVar59._0_4_ = (float)local_6a0._0_4_ * fVar140;
            auVar59._8_4_ = fStack_698 * fVar94;
            auVar59._12_4_ = fStack_694 * fVar95;
            auVar59._16_4_ = fStack_690 * fVar96;
            auVar59._20_4_ = fStack_68c * fVar97;
            auVar59._24_4_ = fStack_688 * fVar98;
            auVar59._28_4_ = auVar18._28_4_;
            auVar7 = vfmadd213ps_fma(auVar229,local_520,auVar59);
            auVar7 = vfmadd213ps_fma(auVar175,local_6c0,ZEXT1632(auVar7));
            auVar7 = vfmadd132ps_fma(auVar130,ZEXT1632(auVar7),local_5e0);
            auVar60._4_4_ = (float)local_6a0._4_4_ * fStack_8bc;
            auVar60._0_4_ = (float)local_6a0._0_4_ * local_8c0;
            auVar60._8_4_ = fStack_698 * fStack_8b8;
            auVar60._12_4_ = fStack_694 * fStack_8b4;
            auVar60._16_4_ = fStack_690 * fStack_8b0;
            auVar60._20_4_ = fStack_68c * fStack_8ac;
            auVar60._24_4_ = fStack_688 * fStack_8a8;
            auVar60._28_4_ = auVar18._28_4_;
            auVar8 = vfmadd213ps_fma(auVar203,local_520,auVar60);
            auVar8 = vfmadd213ps_fma(auVar147,local_6c0,ZEXT1632(auVar8));
            auVar147 = *(undefined1 (*) [32])(lVar19 + 0x222cd38 + lVar113 * 4);
            auVar203 = *(undefined1 (*) [32])(lVar19 + 0x222d1bc + lVar113 * 4);
            auVar175 = *(undefined1 (*) [32])(lVar19 + 0x222d640 + lVar113 * 4);
            pfVar3 = (float *)(lVar19 + 0x222dac4 + lVar113 * 4);
            fVar158 = *pfVar3;
            fVar157 = pfVar3[1];
            fVar135 = pfVar3[2];
            fVar136 = pfVar3[3];
            fVar137 = pfVar3[4];
            fVar138 = pfVar3[5];
            fVar139 = pfVar3[6];
            auVar216._0_4_ = local_780 * fVar158;
            auVar216._4_4_ = fStack_77c * fVar157;
            auVar216._8_4_ = fStack_778 * fVar135;
            auVar216._12_4_ = fStack_774 * fVar136;
            auVar216._16_4_ = fStack_770 * fVar137;
            auVar216._20_4_ = fStack_76c * fVar138;
            auVar216._24_4_ = fStack_768 * fVar139;
            auVar216._28_4_ = 0;
            auVar230._0_4_ = fVar180 * fVar158;
            auVar230._4_4_ = fVar186 * fVar157;
            auVar230._8_4_ = fVar180 * fVar135;
            auVar230._12_4_ = fVar186 * fVar136;
            auVar230._16_4_ = fVar180 * fVar137;
            auVar230._20_4_ = fVar186 * fVar138;
            auVar230._24_4_ = fVar180 * fVar139;
            auVar230._28_4_ = 0;
            auVar61._4_4_ = (float)local_6a0._4_4_ * fVar157;
            auVar61._0_4_ = (float)local_6a0._0_4_ * fVar158;
            auVar61._8_4_ = fStack_698 * fVar135;
            auVar61._12_4_ = fStack_694 * fVar136;
            auVar61._16_4_ = fStack_690 * fVar137;
            auVar61._20_4_ = fStack_68c * fVar138;
            auVar61._24_4_ = fStack_688 * fVar139;
            auVar61._28_4_ = pfVar3[7];
            auVar11 = vfmadd231ps_fma(auVar216,auVar175,auVar169);
            auVar118 = vfmadd231ps_fma(auVar230,auVar175,auVar206);
            auVar209 = vfmadd231ps_fma(auVar61,local_520,auVar175);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar203,local_7a0);
            auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),auVar203,local_6e0);
            auVar209 = vfmadd231ps_fma(ZEXT1632(auVar209),auVar203,local_6c0);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar147,auVar238);
            auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),auVar147,local_580);
            auVar209 = vfmadd231ps_fma(ZEXT1632(auVar209),local_5e0,auVar147);
            pfVar3 = (float *)(lVar19 + 0x222fee4 + lVar113 * 4);
            fVar158 = *pfVar3;
            fVar157 = pfVar3[1];
            fVar135 = pfVar3[2];
            fVar136 = pfVar3[3];
            fVar137 = pfVar3[4];
            fVar138 = pfVar3[5];
            fVar139 = pfVar3[6];
            auVar62._4_4_ = fStack_77c * fVar157;
            auVar62._0_4_ = local_780 * fVar158;
            auVar62._8_4_ = fStack_778 * fVar135;
            auVar62._12_4_ = fStack_774 * fVar136;
            auVar62._16_4_ = fStack_770 * fVar137;
            auVar62._20_4_ = fStack_76c * fVar138;
            auVar62._24_4_ = fStack_768 * fVar139;
            auVar62._28_4_ = fStack_764;
            auVar63._4_4_ = fVar186 * fVar157;
            auVar63._0_4_ = fVar180 * fVar158;
            auVar63._8_4_ = fVar180 * fVar135;
            auVar63._12_4_ = fVar186 * fVar136;
            auVar63._16_4_ = fVar180 * fVar137;
            auVar63._20_4_ = fVar186 * fVar138;
            auVar63._24_4_ = fVar180 * fVar139;
            auVar63._28_4_ = fVar186;
            auVar64._4_4_ = (float)local_6a0._4_4_ * fVar157;
            auVar64._0_4_ = (float)local_6a0._0_4_ * fVar158;
            auVar64._8_4_ = fStack_698 * fVar135;
            auVar64._12_4_ = fStack_694 * fVar136;
            auVar64._16_4_ = fStack_690 * fVar137;
            auVar64._20_4_ = fStack_68c * fVar138;
            auVar64._24_4_ = fStack_688 * fVar139;
            auVar64._28_4_ = pfVar3[7];
            auVar147 = *(undefined1 (*) [32])(lVar19 + 0x222fa60 + lVar113 * 4);
            auVar187 = vfmadd231ps_fma(auVar62,auVar147,auVar169);
            auVar21 = vfmadd231ps_fma(auVar63,auVar147,auVar206);
            auVar204 = vfmadd231ps_fma(auVar64,local_520,auVar147);
            auVar147 = *(undefined1 (*) [32])(lVar19 + 0x222f5dc + lVar113 * 4);
            auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar147,local_7a0);
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar147,local_6e0);
            auVar204 = vfmadd231ps_fma(ZEXT1632(auVar204),auVar147,local_6c0);
            auVar147 = *(undefined1 (*) [32])(lVar19 + 0x222f158 + lVar113 * 4);
            auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar147,auVar238);
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar147,local_580);
            auVar204 = vfmadd231ps_fma(ZEXT1632(auVar204),local_5e0,auVar147);
            auVar147 = vandps_avx(ZEXT1632(auVar11),local_2c0);
            auVar203 = vandps_avx(ZEXT1632(auVar118),local_2c0);
            auVar203 = vmaxps_avx(auVar147,auVar203);
            auVar147 = vandps_avx(ZEXT1632(auVar209),local_2c0);
            auVar147 = vmaxps_avx(auVar203,auVar147);
            auVar147 = vcmpps_avx(auVar147,_local_380,1);
            auVar175 = vblendvps_avx(ZEXT1632(auVar11),auVar215,auVar147);
            auVar229 = vblendvps_avx(ZEXT1632(auVar118),local_340,auVar147);
            auVar147 = vandps_avx(ZEXT1632(auVar187),local_2c0);
            auVar203 = vandps_avx(ZEXT1632(auVar21),local_2c0);
            auVar203 = vmaxps_avx(auVar147,auVar203);
            auVar147 = vandps_avx(local_2c0,ZEXT1632(auVar204));
            auVar147 = vmaxps_avx(auVar203,auVar147);
            auVar203 = vcmpps_avx(auVar147,_local_380,1);
            auVar147 = vblendvps_avx(ZEXT1632(auVar187),auVar215,auVar203);
            auVar203 = vblendvps_avx(ZEXT1632(auVar21),local_340,auVar203);
            auVar8 = vfmadd213ps_fma(auVar128,local_5e0,ZEXT1632(auVar8));
            auVar11 = vfmadd213ps_fma(auVar175,auVar175,ZEXT832(0) << 0x20);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar229,auVar229);
            auVar128 = vrsqrtps_avx(ZEXT1632(auVar11));
            fVar158 = auVar128._0_4_;
            fVar157 = auVar128._4_4_;
            fVar135 = auVar128._8_4_;
            fVar136 = auVar128._12_4_;
            fVar137 = auVar128._16_4_;
            fVar138 = auVar128._20_4_;
            fVar139 = auVar128._24_4_;
            auVar65._4_4_ = fVar157 * fVar157 * fVar157 * auVar11._4_4_ * -0.5;
            auVar65._0_4_ = fVar158 * fVar158 * fVar158 * auVar11._0_4_ * -0.5;
            auVar65._8_4_ = fVar135 * fVar135 * fVar135 * auVar11._8_4_ * -0.5;
            auVar65._12_4_ = fVar136 * fVar136 * fVar136 * auVar11._12_4_ * -0.5;
            auVar65._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
            auVar65._20_4_ = fVar138 * fVar138 * fVar138 * -0.0;
            auVar65._24_4_ = fVar139 * fVar139 * fVar139 * -0.0;
            auVar65._28_4_ = 0;
            auVar239._8_4_ = 0x3fc00000;
            auVar239._0_8_ = 0x3fc000003fc00000;
            auVar239._12_4_ = 0x3fc00000;
            auVar239._16_4_ = 0x3fc00000;
            auVar239._20_4_ = 0x3fc00000;
            auVar239._24_4_ = 0x3fc00000;
            auVar239._28_4_ = 0x3fc00000;
            auVar11 = vfmadd231ps_fma(auVar65,auVar239,auVar128);
            fVar158 = auVar11._0_4_;
            fVar157 = auVar11._4_4_;
            auVar66._4_4_ = auVar229._4_4_ * fVar157;
            auVar66._0_4_ = auVar229._0_4_ * fVar158;
            fVar135 = auVar11._8_4_;
            auVar66._8_4_ = auVar229._8_4_ * fVar135;
            fVar136 = auVar11._12_4_;
            auVar66._12_4_ = auVar229._12_4_ * fVar136;
            auVar66._16_4_ = auVar229._16_4_ * 0.0;
            auVar66._20_4_ = auVar229._20_4_ * 0.0;
            auVar66._24_4_ = auVar229._24_4_ * 0.0;
            auVar66._28_4_ = auVar229._28_4_;
            auVar67._4_4_ = fVar157 * -auVar175._4_4_;
            auVar67._0_4_ = fVar158 * -auVar175._0_4_;
            auVar67._8_4_ = fVar135 * -auVar175._8_4_;
            auVar67._12_4_ = fVar136 * -auVar175._12_4_;
            auVar67._16_4_ = -auVar175._16_4_ * 0.0;
            auVar67._20_4_ = -auVar175._20_4_ * 0.0;
            auVar67._24_4_ = -auVar175._24_4_ * 0.0;
            auVar67._28_4_ = auVar128._28_4_;
            auVar11 = vfmadd213ps_fma(auVar147,auVar147,ZEXT832(0) << 0x20);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar203,auVar203);
            auVar128 = vrsqrtps_avx(ZEXT1632(auVar11));
            auVar68._28_4_ = local_5e0._28_4_;
            auVar68._0_28_ =
                 ZEXT1628(CONCAT412(fVar136 * 0.0,
                                    CONCAT48(fVar135 * 0.0,CONCAT44(fVar157 * 0.0,fVar158 * 0.0))));
            fVar158 = auVar128._0_4_;
            fVar157 = auVar128._4_4_;
            fVar135 = auVar128._8_4_;
            fVar136 = auVar128._12_4_;
            fVar137 = auVar128._16_4_;
            fVar138 = auVar128._20_4_;
            fVar139 = auVar128._24_4_;
            auVar69._4_4_ = fVar157 * fVar157 * fVar157 * auVar11._4_4_ * -0.5;
            auVar69._0_4_ = fVar158 * fVar158 * fVar158 * auVar11._0_4_ * -0.5;
            auVar69._8_4_ = fVar135 * fVar135 * fVar135 * auVar11._8_4_ * -0.5;
            auVar69._12_4_ = fVar136 * fVar136 * fVar136 * auVar11._12_4_ * -0.5;
            auVar69._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
            auVar69._20_4_ = fVar138 * fVar138 * fVar138 * -0.0;
            auVar69._24_4_ = fVar139 * fVar139 * fVar139 * -0.0;
            auVar69._28_4_ = 0;
            auVar11 = vfmadd231ps_fma(auVar69,auVar239,auVar128);
            fVar158 = auVar11._0_4_;
            fVar157 = auVar11._4_4_;
            auVar70._4_4_ = auVar203._4_4_ * fVar157;
            auVar70._0_4_ = auVar203._0_4_ * fVar158;
            fVar135 = auVar11._8_4_;
            auVar70._8_4_ = auVar203._8_4_ * fVar135;
            fVar136 = auVar11._12_4_;
            auVar70._12_4_ = auVar203._12_4_ * fVar136;
            auVar70._16_4_ = auVar203._16_4_ * 0.0;
            auVar70._20_4_ = auVar203._20_4_ * 0.0;
            auVar70._24_4_ = auVar203._24_4_ * 0.0;
            auVar70._28_4_ = 0;
            auVar71._4_4_ = fVar157 * -auVar147._4_4_;
            auVar71._0_4_ = fVar158 * -auVar147._0_4_;
            auVar71._8_4_ = fVar135 * -auVar147._8_4_;
            auVar71._12_4_ = fVar136 * -auVar147._12_4_;
            auVar71._16_4_ = -auVar147._16_4_ * 0.0;
            auVar71._20_4_ = -auVar147._20_4_ * 0.0;
            auVar71._24_4_ = -auVar147._24_4_ * 0.0;
            auVar71._28_4_ = auVar128._28_4_;
            auVar72._28_4_ = 0xbf000000;
            auVar72._0_28_ =
                 ZEXT1628(CONCAT412(fVar136 * 0.0,
                                    CONCAT48(fVar135 * 0.0,CONCAT44(fVar157 * 0.0,fVar158 * 0.0))));
            auVar11 = vfmadd213ps_fma(auVar66,ZEXT1632(auVar190),local_320);
            auVar128 = ZEXT1632(auVar190);
            auVar118 = vfmadd213ps_fma(auVar67,auVar128,auVar122);
            auVar209 = vfmadd213ps_fma(auVar68,auVar128,ZEXT1632(auVar8));
            auVar204 = vfnmadd213ps_fma(auVar66,auVar128,local_320);
            auVar187 = vfmadd213ps_fma(auVar70,_local_700,_local_5c0);
            auVar205 = vfnmadd213ps_fma(auVar67,auVar128,auVar122);
            auVar21 = vfmadd213ps_fma(auVar71,_local_700,local_5a0);
            auVar174 = ZEXT1632(auVar190);
            auVar190 = vfnmadd231ps_fma(ZEXT1632(auVar8),auVar174,auVar68);
            auVar8 = vfmadd213ps_fma(auVar72,_local_700,ZEXT1632(auVar7));
            auVar210 = vfnmadd213ps_fma(auVar70,_local_700,_local_5c0);
            auVar211 = vfnmadd213ps_fma(auVar71,_local_700,local_5a0);
            auVar219 = vfnmadd231ps_fma(ZEXT1632(auVar7),_local_700,auVar72);
            auVar128 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar205));
            auVar147 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar190));
            auVar73._4_4_ = auVar128._4_4_ * auVar190._4_4_;
            auVar73._0_4_ = auVar128._0_4_ * auVar190._0_4_;
            auVar73._8_4_ = auVar128._8_4_ * auVar190._8_4_;
            auVar73._12_4_ = auVar128._12_4_ * auVar190._12_4_;
            auVar73._16_4_ = auVar128._16_4_ * 0.0;
            auVar73._20_4_ = auVar128._20_4_ * 0.0;
            auVar73._24_4_ = auVar128._24_4_ * 0.0;
            auVar73._28_4_ = 0;
            auVar7 = vfmsub231ps_fma(auVar73,ZEXT1632(auVar205),auVar147);
            auVar74._4_4_ = auVar204._4_4_ * auVar147._4_4_;
            auVar74._0_4_ = auVar204._0_4_ * auVar147._0_4_;
            auVar74._8_4_ = auVar204._8_4_ * auVar147._8_4_;
            auVar74._12_4_ = auVar204._12_4_ * auVar147._12_4_;
            auVar74._16_4_ = auVar147._16_4_ * 0.0;
            auVar74._20_4_ = auVar147._20_4_ * 0.0;
            auVar74._24_4_ = auVar147._24_4_ * 0.0;
            auVar74._28_4_ = auVar147._28_4_;
            auVar222 = ZEXT1632(auVar204);
            auVar147 = vsubps_avx(ZEXT1632(auVar187),auVar222);
            auVar130 = ZEXT1632(auVar190);
            auVar190 = vfmsub231ps_fma(auVar74,auVar130,auVar147);
            auVar75._4_4_ = auVar205._4_4_ * auVar147._4_4_;
            auVar75._0_4_ = auVar205._0_4_ * auVar147._0_4_;
            auVar75._8_4_ = auVar205._8_4_ * auVar147._8_4_;
            auVar75._12_4_ = auVar205._12_4_ * auVar147._12_4_;
            auVar75._16_4_ = auVar147._16_4_ * 0.0;
            auVar75._20_4_ = auVar147._20_4_ * 0.0;
            auVar75._24_4_ = auVar147._24_4_ * 0.0;
            auVar75._28_4_ = auVar147._28_4_;
            auVar204 = vfmsub231ps_fma(auVar75,auVar222,auVar128);
            auVar190 = vfmadd231ps_fma(ZEXT1632(auVar204),ZEXT832(0) << 0x20,ZEXT1632(auVar190));
            auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
            auVar122 = vcmpps_avx(ZEXT1632(auVar190),ZEXT832(0) << 0x20,2);
            auVar128 = vblendvps_avx(ZEXT1632(auVar210),ZEXT1632(auVar11),auVar122);
            auVar147 = vblendvps_avx(ZEXT1632(auVar211),ZEXT1632(auVar118),auVar122);
            auVar203 = vblendvps_avx(ZEXT1632(auVar219),ZEXT1632(auVar209),auVar122);
            auVar175 = vblendvps_avx(auVar222,ZEXT1632(auVar187),auVar122);
            auVar229 = vblendvps_avx(ZEXT1632(auVar205),ZEXT1632(auVar21),auVar122);
            auVar18 = vblendvps_avx(auVar130,ZEXT1632(auVar8),auVar122);
            auVar222 = vblendvps_avx(ZEXT1632(auVar187),auVar222,auVar122);
            auVar17 = vblendvps_avx(ZEXT1632(auVar21),ZEXT1632(auVar205),auVar122);
            auVar190 = vpackssdw_avx(local_540._0_16_,local_540._16_16_);
            auVar130 = vblendvps_avx(ZEXT1632(auVar8),auVar130,auVar122);
            auVar222 = vsubps_avx(auVar222,auVar128);
            auVar17 = vsubps_avx(auVar17,auVar147);
            auVar142 = vsubps_avx(auVar130,auVar203);
            auVar233 = ZEXT3264(auVar142);
            auVar170 = vsubps_avx(auVar128,auVar175);
            auVar212 = vsubps_avx(auVar147,auVar229);
            auVar213 = vsubps_avx(auVar203,auVar18);
            auVar200._0_4_ = auVar142._0_4_ * auVar128._0_4_;
            auVar200._4_4_ = auVar142._4_4_ * auVar128._4_4_;
            auVar200._8_4_ = auVar142._8_4_ * auVar128._8_4_;
            auVar200._12_4_ = auVar142._12_4_ * auVar128._12_4_;
            auVar200._16_4_ = auVar142._16_4_ * auVar128._16_4_;
            auVar200._20_4_ = auVar142._20_4_ * auVar128._20_4_;
            auVar200._24_4_ = auVar142._24_4_ * auVar128._24_4_;
            auVar200._28_4_ = 0;
            auVar7 = vfmsub231ps_fma(auVar200,auVar203,auVar222);
            auVar76._4_4_ = auVar222._4_4_ * auVar147._4_4_;
            auVar76._0_4_ = auVar222._0_4_ * auVar147._0_4_;
            auVar76._8_4_ = auVar222._8_4_ * auVar147._8_4_;
            auVar76._12_4_ = auVar222._12_4_ * auVar147._12_4_;
            auVar76._16_4_ = auVar222._16_4_ * auVar147._16_4_;
            auVar76._20_4_ = auVar222._20_4_ * auVar147._20_4_;
            auVar76._24_4_ = auVar222._24_4_ * auVar147._24_4_;
            auVar76._28_4_ = auVar130._28_4_;
            auVar8 = vfmsub231ps_fma(auVar76,auVar128,auVar17);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar7),_DAT_02020f00);
            auVar201._0_4_ = auVar17._0_4_ * auVar203._0_4_;
            auVar201._4_4_ = auVar17._4_4_ * auVar203._4_4_;
            auVar201._8_4_ = auVar17._8_4_ * auVar203._8_4_;
            auVar201._12_4_ = auVar17._12_4_ * auVar203._12_4_;
            auVar201._16_4_ = auVar17._16_4_ * auVar203._16_4_;
            auVar201._20_4_ = auVar17._20_4_ * auVar203._20_4_;
            auVar201._24_4_ = auVar17._24_4_ * auVar203._24_4_;
            auVar201._28_4_ = 0;
            auVar8 = vfmsub231ps_fma(auVar201,auVar147,auVar142);
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
            auVar179 = ZEXT1664(auVar8);
            auVar202._0_4_ = auVar213._0_4_ * auVar175._0_4_;
            auVar202._4_4_ = auVar213._4_4_ * auVar175._4_4_;
            auVar202._8_4_ = auVar213._8_4_ * auVar175._8_4_;
            auVar202._12_4_ = auVar213._12_4_ * auVar175._12_4_;
            auVar202._16_4_ = auVar213._16_4_ * auVar175._16_4_;
            auVar202._20_4_ = auVar213._20_4_ * auVar175._20_4_;
            auVar202._24_4_ = auVar213._24_4_ * auVar175._24_4_;
            auVar202._28_4_ = 0;
            auVar7 = vfmsub231ps_fma(auVar202,auVar170,auVar18);
            auVar77._4_4_ = auVar212._4_4_ * auVar18._4_4_;
            auVar77._0_4_ = auVar212._0_4_ * auVar18._0_4_;
            auVar77._8_4_ = auVar212._8_4_ * auVar18._8_4_;
            auVar77._12_4_ = auVar212._12_4_ * auVar18._12_4_;
            auVar77._16_4_ = auVar212._16_4_ * auVar18._16_4_;
            auVar77._20_4_ = auVar212._20_4_ * auVar18._20_4_;
            auVar77._24_4_ = auVar212._24_4_ * auVar18._24_4_;
            auVar77._28_4_ = auVar18._28_4_;
            auVar11 = vfmsub231ps_fma(auVar77,auVar229,auVar213);
            auVar78._4_4_ = auVar170._4_4_ * auVar229._4_4_;
            auVar78._0_4_ = auVar170._0_4_ * auVar229._0_4_;
            auVar78._8_4_ = auVar170._8_4_ * auVar229._8_4_;
            auVar78._12_4_ = auVar170._12_4_ * auVar229._12_4_;
            auVar78._16_4_ = auVar170._16_4_ * auVar229._16_4_;
            auVar78._20_4_ = auVar170._20_4_ * auVar229._20_4_;
            auVar78._24_4_ = auVar170._24_4_ * auVar229._24_4_;
            auVar78._28_4_ = auVar229._28_4_;
            auVar118 = vfmsub231ps_fma(auVar78,auVar212,auVar175);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar118),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
            auVar175 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar11));
            auVar175 = vcmpps_avx(auVar175,ZEXT832(0) << 0x20,2);
            auVar7 = vpackssdw_avx(auVar175._0_16_,auVar175._16_16_);
            auVar7 = vpand_avx(auVar7,auVar190);
            auVar175 = vpmovsxwd_avx2(auVar7);
            if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar175 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar175 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar175 >> 0x7f,0) == '\0') &&
                  (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar175 >> 0xbf,0) == '\0') &&
                (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar175[0x1f]) {
LAB_01856e09:
              auVar223 = ZEXT3264(CONCAT824(uStack_608,
                                            CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
            }
            else {
              auVar79._4_4_ = auVar17._4_4_ * auVar213._4_4_;
              auVar79._0_4_ = auVar17._0_4_ * auVar213._0_4_;
              auVar79._8_4_ = auVar17._8_4_ * auVar213._8_4_;
              auVar79._12_4_ = auVar17._12_4_ * auVar213._12_4_;
              auVar79._16_4_ = auVar17._16_4_ * auVar213._16_4_;
              auVar79._20_4_ = auVar17._20_4_ * auVar213._20_4_;
              auVar79._24_4_ = auVar17._24_4_ * auVar213._24_4_;
              auVar79._28_4_ = auVar175._28_4_;
              auVar21 = vfmsub231ps_fma(auVar79,auVar212,auVar142);
              auVar207._0_4_ = auVar142._0_4_ * auVar170._0_4_;
              auVar207._4_4_ = auVar142._4_4_ * auVar170._4_4_;
              auVar207._8_4_ = auVar142._8_4_ * auVar170._8_4_;
              auVar207._12_4_ = auVar142._12_4_ * auVar170._12_4_;
              auVar207._16_4_ = auVar142._16_4_ * auVar170._16_4_;
              auVar207._20_4_ = auVar142._20_4_ * auVar170._20_4_;
              auVar207._24_4_ = auVar142._24_4_ * auVar170._24_4_;
              auVar207._28_4_ = 0;
              auVar187 = vfmsub231ps_fma(auVar207,auVar222,auVar213);
              auVar80._4_4_ = auVar222._4_4_ * auVar212._4_4_;
              auVar80._0_4_ = auVar222._0_4_ * auVar212._0_4_;
              auVar80._8_4_ = auVar222._8_4_ * auVar212._8_4_;
              auVar80._12_4_ = auVar222._12_4_ * auVar212._12_4_;
              auVar80._16_4_ = auVar222._16_4_ * auVar212._16_4_;
              auVar80._20_4_ = auVar222._20_4_ * auVar212._20_4_;
              auVar80._24_4_ = auVar222._24_4_ * auVar212._24_4_;
              auVar80._28_4_ = auVar212._28_4_;
              auVar204 = vfmsub231ps_fma(auVar80,auVar170,auVar17);
              auVar118 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar187),ZEXT1632(auVar204));
              auVar209 = vfmadd231ps_fma(ZEXT1632(auVar118),ZEXT1632(auVar21),ZEXT832(0) << 0x20);
              auVar175 = vrcpps_avx(ZEXT1632(auVar209));
              auVar231._8_4_ = 0x3f800000;
              auVar231._0_8_ = &DAT_3f8000003f800000;
              auVar231._12_4_ = 0x3f800000;
              auVar231._16_4_ = 0x3f800000;
              auVar231._20_4_ = 0x3f800000;
              auVar231._24_4_ = 0x3f800000;
              auVar231._28_4_ = 0x3f800000;
              auVar233 = ZEXT3264(auVar231);
              auVar118 = vfnmadd213ps_fma(auVar175,ZEXT1632(auVar209),auVar231);
              auVar118 = vfmadd132ps_fma(ZEXT1632(auVar118),auVar175,auVar175);
              auVar183._0_4_ = auVar204._0_4_ * auVar203._0_4_;
              auVar183._4_4_ = auVar204._4_4_ * auVar203._4_4_;
              auVar183._8_4_ = auVar204._8_4_ * auVar203._8_4_;
              auVar183._12_4_ = auVar204._12_4_ * auVar203._12_4_;
              auVar183._16_4_ = auVar203._16_4_ * 0.0;
              auVar183._20_4_ = auVar203._20_4_ * 0.0;
              auVar183._24_4_ = auVar203._24_4_ * 0.0;
              auVar183._28_4_ = 0;
              auVar187 = vfmadd231ps_fma(auVar183,ZEXT1632(auVar187),auVar147);
              auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar128,ZEXT1632(auVar21));
              fVar158 = auVar118._0_4_;
              fVar157 = auVar118._4_4_;
              fVar135 = auVar118._8_4_;
              fVar136 = auVar118._12_4_;
              auVar203 = ZEXT1632(CONCAT412(fVar136 * auVar187._12_4_,
                                            CONCAT48(fVar135 * auVar187._8_4_,
                                                     CONCAT44(fVar157 * auVar187._4_4_,
                                                              fVar158 * auVar187._0_4_))));
              uVar116 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar184._4_4_ = uVar116;
              auVar184._0_4_ = uVar116;
              auVar184._8_4_ = uVar116;
              auVar184._12_4_ = uVar116;
              auVar184._16_4_ = uVar116;
              auVar184._20_4_ = uVar116;
              auVar184._24_4_ = uVar116;
              auVar184._28_4_ = uVar116;
              auVar104._4_4_ = uStack_5fc;
              auVar104._0_4_ = local_600;
              auVar104._8_4_ = uStack_5f8;
              auVar104._12_4_ = uStack_5f4;
              auVar104._16_4_ = uStack_5f0;
              auVar104._20_4_ = uStack_5ec;
              auVar104._24_4_ = uStack_5e8;
              auVar104._28_4_ = uStack_5e4;
              auVar128 = vcmpps_avx(auVar104,auVar203,2);
              auVar147 = vcmpps_avx(auVar203,auVar184,2);
              auVar128 = vandps_avx(auVar147,auVar128);
              auVar118 = vpackssdw_avx(auVar128._0_16_,auVar128._16_16_);
              auVar7 = vpand_avx(auVar7,auVar118);
              auVar128 = vpmovsxwd_avx2(auVar7);
              if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar128 >> 0x7f,0) == '\0') &&
                    (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar128 >> 0xbf,0) == '\0') &&
                  (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar128[0x1f]) goto LAB_01856e09;
              auVar128 = vcmpps_avx(ZEXT1632(auVar209),ZEXT832(0) << 0x20,4);
              auVar118 = vpackssdw_avx(auVar128._0_16_,auVar128._16_16_);
              auVar7 = vpand_avx(auVar7,auVar118);
              auVar128 = vpmovsxwd_avx2(auVar7);
              auVar223 = ZEXT3264(CONCAT824(uStack_608,
                                            CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
              if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar128 >> 0x7f,0) != '\0') ||
                    (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar128 >> 0xbf,0) != '\0') ||
                  (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar128[0x1f] < '\0') {
                auVar175 = ZEXT1632(CONCAT412(fVar136 * auVar8._12_4_,
                                              CONCAT48(fVar135 * auVar8._8_4_,
                                                       CONCAT44(fVar157 * auVar8._4_4_,
                                                                fVar158 * auVar8._0_4_))));
                auVar81._28_4_ = SUB84(uStack_608,4);
                auVar81._0_28_ =
                     ZEXT1628(CONCAT412(fVar136 * auVar11._12_4_,
                                        CONCAT48(fVar135 * auVar11._8_4_,
                                                 CONCAT44(fVar157 * auVar11._4_4_,
                                                          fVar158 * auVar11._0_4_))));
                auVar217._8_4_ = 0x3f800000;
                auVar217._0_8_ = &DAT_3f8000003f800000;
                auVar217._12_4_ = 0x3f800000;
                auVar217._16_4_ = 0x3f800000;
                auVar217._20_4_ = 0x3f800000;
                auVar217._24_4_ = 0x3f800000;
                auVar217._28_4_ = 0x3f800000;
                auVar147 = vsubps_avx(auVar217,auVar175);
                local_120 = vblendvps_avx(auVar147,auVar175,auVar122);
                auVar147 = vsubps_avx(auVar217,auVar81);
                local_3c0 = vblendvps_avx(auVar147,auVar81,auVar122);
                auVar179 = ZEXT3264(local_3c0);
                auVar223 = ZEXT3264(auVar128);
                local_560 = auVar203;
              }
            }
            auVar224 = ZEXT3264(auVar132);
            auVar128 = auVar223._0_32_;
            auVar203 = _local_700;
            if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar128 >> 0x7f,0) == '\0') &&
                  (auVar223 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar128 >> 0xbf,0) == '\0') &&
                (auVar223 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar223[0x1f]) goto LAB_01856aa7;
            auVar147 = vsubps_avx(_local_700,auVar174);
            auVar7 = vfmadd213ps_fma(auVar147,local_120,auVar174);
            fVar158 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar82._4_4_ = (auVar7._4_4_ + auVar7._4_4_) * fVar158;
            auVar82._0_4_ = (auVar7._0_4_ + auVar7._0_4_) * fVar158;
            auVar82._8_4_ = (auVar7._8_4_ + auVar7._8_4_) * fVar158;
            auVar82._12_4_ = (auVar7._12_4_ + auVar7._12_4_) * fVar158;
            auVar82._16_4_ = fVar158 * 0.0;
            auVar82._20_4_ = fVar158 * 0.0;
            auVar82._24_4_ = fVar158 * 0.0;
            auVar82._28_4_ = fVar158;
            auVar147 = vcmpps_avx(local_560,auVar82,6);
            auVar203 = auVar128 & auVar147;
            auVar214 = ZEXT3264(CONCAT428(fStack_764,
                                          CONCAT424(fStack_768,
                                                    CONCAT420(fStack_76c,
                                                              CONCAT416(fStack_770,
                                                                        CONCAT412(fStack_774,
                                                                                  CONCAT48(
                                                  fStack_778,CONCAT44(fStack_77c,local_780))))))));
            auVar218 = ZEXT3264(local_7a0);
            if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar203 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar203 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar203 >> 0x7f,0) != '\0') ||
                  (auVar203 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar203 >> 0xbf,0) != '\0') ||
                (auVar203 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar203[0x1f] < '\0') {
              local_440 = vandps_avx(auVar147,auVar128);
              auVar150._8_4_ = 0xbf800000;
              auVar150._0_8_ = 0xbf800000bf800000;
              auVar150._12_4_ = 0xbf800000;
              auVar150._16_4_ = 0xbf800000;
              auVar150._20_4_ = 0xbf800000;
              auVar150._24_4_ = 0xbf800000;
              auVar150._28_4_ = 0xbf800000;
              auVar176._8_4_ = 0x40000000;
              auVar176._0_8_ = 0x4000000040000000;
              auVar176._12_4_ = 0x40000000;
              auVar176._16_4_ = 0x40000000;
              auVar176._20_4_ = 0x40000000;
              auVar176._24_4_ = 0x40000000;
              auVar176._28_4_ = 0x40000000;
              auVar179 = ZEXT3264(auVar176);
              auVar7 = vfmadd213ps_fma(local_3c0,auVar176,auVar150);
              local_500 = local_120;
              local_4e0 = ZEXT1632(auVar7);
              local_3c0 = local_4e0;
              auVar128 = local_3c0;
              local_4c0 = local_560;
              local_480 = local_740._0_8_;
              uStack_478 = local_740._8_8_;
              local_470 = local_750._0_8_;
              uStack_468 = local_750._8_8_;
              local_460 = local_760;
              uStack_458 = uStack_758;
              pGVar114 = (context->scene->geometries).items[uVar110].ptr;
              local_3c0 = auVar128;
              if ((pGVar114->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar158 = (float)local_4a0;
                local_420[0] = (fVar158 + local_120._0_4_ + 0.0) * local_140;
                local_420[1] = (fVar158 + local_120._4_4_ + 1.0) * fStack_13c;
                local_420[2] = (fVar158 + local_120._8_4_ + 2.0) * fStack_138;
                local_420[3] = (fVar158 + local_120._12_4_ + 3.0) * fStack_134;
                fStack_410 = (fVar158 + local_120._16_4_ + 4.0) * fStack_130;
                fStack_40c = (fVar158 + local_120._20_4_ + 5.0) * fStack_12c;
                fStack_408 = (fVar158 + local_120._24_4_ + 6.0) * fStack_128;
                fStack_404 = fVar158 + local_120._28_4_ + 7.0;
                local_3c0._0_8_ = auVar7._0_8_;
                local_3c0._8_8_ = auVar7._8_8_;
                local_400 = local_3c0._0_8_;
                uStack_3f8 = local_3c0._8_8_;
                uStack_3f0 = 0;
                uStack_3e8 = 0;
                local_3e0 = local_560;
                auVar151._8_4_ = 0x7f800000;
                auVar151._0_8_ = 0x7f8000007f800000;
                auVar151._12_4_ = 0x7f800000;
                auVar151._16_4_ = 0x7f800000;
                auVar151._20_4_ = 0x7f800000;
                auVar151._24_4_ = 0x7f800000;
                auVar151._28_4_ = 0x7f800000;
                auVar128 = vblendvps_avx(auVar151,local_560,local_440);
                auVar147 = vshufps_avx(auVar128,auVar128,0xb1);
                auVar147 = vminps_avx(auVar128,auVar147);
                auVar203 = vshufpd_avx(auVar147,auVar147,5);
                auVar147 = vminps_avx(auVar147,auVar203);
                auVar203 = vpermpd_avx2(auVar147,0x4e);
                auVar147 = vminps_avx(auVar147,auVar203);
                auVar147 = vcmpps_avx(auVar128,auVar147,0);
                auVar203 = local_440 & auVar147;
                auVar128 = local_440;
                if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar203 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar203 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar203 >> 0x7f,0) != '\0') ||
                      (auVar203 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar203 >> 0xbf,0) != '\0') ||
                    (auVar203 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar203[0x1f] < '\0') {
                  auVar128 = vandps_avx(auVar147,local_440);
                }
                uVar108 = vmovmskps_avx(auVar128);
                uVar112 = 0;
                for (; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x80000000) {
                  uVar112 = uVar112 + 1;
                }
                uVar109 = (ulong)uVar112;
                local_920 = ZEXT1632(CONCAT88(auVar190._8_8_,uVar109));
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar114->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar158 = local_420[uVar109];
                  uVar116 = *(undefined4 *)((long)&local_400 + uVar109 * 4);
                  fVar157 = 1.0 - fVar158;
                  auVar190 = ZEXT416((uint)(fVar158 * fVar157 * 4.0));
                  auVar195 = vfnmsub213ss_fma(ZEXT416((uint)fVar158),ZEXT416((uint)fVar158),auVar190
                                             );
                  auVar190 = vfmadd213ss_fma(ZEXT416((uint)fVar157),ZEXT416((uint)fVar157),auVar190)
                  ;
                  fVar157 = fVar157 * -fVar157 * 0.5;
                  fVar135 = auVar195._0_4_ * 0.5;
                  fVar136 = auVar190._0_4_ * 0.5;
                  fVar137 = fVar158 * fVar158 * 0.5;
                  auVar191._0_4_ = fVar137 * (float)local_760._0_4_;
                  auVar191._4_4_ = fVar137 * (float)local_760._4_4_;
                  auVar191._8_4_ = fVar137 * (float)uStack_758;
                  auVar191._12_4_ = fVar137 * uStack_758._4_4_;
                  auVar161._4_4_ = fVar136;
                  auVar161._0_4_ = fVar136;
                  auVar161._8_4_ = fVar136;
                  auVar161._12_4_ = fVar136;
                  auVar190 = vfmadd132ps_fma(auVar161,auVar191,local_750);
                  auVar192._4_4_ = fVar135;
                  auVar192._0_4_ = fVar135;
                  auVar192._8_4_ = fVar135;
                  auVar192._12_4_ = fVar135;
                  auVar190 = vfmadd132ps_fma(auVar192,auVar190,local_740);
                  auVar162._4_4_ = fVar157;
                  auVar162._0_4_ = fVar157;
                  auVar162._8_4_ = fVar157;
                  auVar162._12_4_ = fVar157;
                  auVar190 = vfmadd132ps_fma(auVar162,auVar190,auVar15);
                  auVar179 = ZEXT1664(auVar190);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar109 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar190._0_4_;
                  uVar225 = vextractps_avx(auVar190,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar225;
                  uVar225 = vextractps_avx(auVar190,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar225;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar158;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar116;
                  *(undefined4 *)(ray + k * 4 + 0x220) = uVar4;
                  *(uint *)(ray + k * 4 + 0x240) = uVar110;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  _local_700 = ZEXT1632(_local_760);
                  local_720 = ZEXT1632(CONCAT88(auVar195._8_8_,lVar113));
                  local_680._8_24_ = auVar215._8_24_;
                  local_680._0_8_ = pGVar114;
                  local_660 = local_440;
                  local_49c = iVar107;
                  local_490 = uVar208;
                  uStack_488 = uVar99;
                  do {
                    auVar147 = local_920;
                    uVar112 = *(uint *)(ray + k * 4 + 0x100);
                    fVar158 = local_420[local_920._0_8_];
                    auVar119._4_4_ = fVar158;
                    auVar119._0_4_ = fVar158;
                    auVar119._8_4_ = fVar158;
                    auVar119._12_4_ = fVar158;
                    local_240._16_4_ = fVar158;
                    local_240._0_16_ = auVar119;
                    local_240._20_4_ = fVar158;
                    local_240._24_4_ = fVar158;
                    local_240._28_4_ = fVar158;
                    uVar116 = *(undefined4 *)((long)&local_400 + local_920._0_8_ * 4);
                    local_220._4_4_ = uVar116;
                    local_220._0_4_ = uVar116;
                    local_220._8_4_ = uVar116;
                    local_220._12_4_ = uVar116;
                    local_220._16_4_ = uVar116;
                    local_220._20_4_ = uVar116;
                    local_220._24_4_ = uVar116;
                    local_220._28_4_ = uVar116;
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)(local_3e0 + local_920._0_8_ * 4);
                    fVar135 = 1.0 - fVar158;
                    auVar190 = ZEXT416((uint)(fVar158 * fVar135 * 4.0));
                    auVar195 = vfnmsub213ss_fma(auVar119,auVar119,auVar190);
                    auVar190 = vfmadd213ss_fma(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135),
                                               auVar190);
                    fVar157 = auVar190._0_4_ * 0.5;
                    fVar158 = fVar158 * fVar158 * 0.5;
                    auVar193._0_4_ = fVar158 * (float)local_700._0_4_;
                    auVar193._4_4_ = fVar158 * (float)local_700._4_4_;
                    auVar193._8_4_ = fVar158 * fStack_6f8;
                    auVar193._12_4_ = fVar158 * fStack_6f4;
                    auVar163._4_4_ = fVar157;
                    auVar163._0_4_ = fVar157;
                    auVar163._8_4_ = fVar157;
                    auVar163._12_4_ = fVar157;
                    auVar190 = vfmadd132ps_fma(auVar163,auVar193,auVar9);
                    fVar158 = auVar195._0_4_ * 0.5;
                    auVar194._4_4_ = fVar158;
                    auVar194._0_4_ = fVar158;
                    auVar194._8_4_ = fVar158;
                    auVar194._12_4_ = fVar158;
                    auVar190 = vfmadd132ps_fma(auVar194,auVar190,auVar10);
                    local_7d0.context = context->user;
                    fVar158 = fVar135 * -fVar135 * 0.5;
                    auVar164._4_4_ = fVar158;
                    auVar164._0_4_ = fVar158;
                    auVar164._8_4_ = fVar158;
                    auVar164._12_4_ = fVar158;
                    auVar195 = vfmadd132ps_fma(auVar164,auVar190,auVar16);
                    local_2a0 = auVar195._0_4_;
                    uStack_29c = local_2a0;
                    uStack_298 = local_2a0;
                    uStack_294 = local_2a0;
                    uStack_290 = local_2a0;
                    uStack_28c = local_2a0;
                    uStack_288 = local_2a0;
                    uStack_284 = local_2a0;
                    auVar190 = vmovshdup_avx(auVar195);
                    auVar181._0_8_ = auVar190._0_8_;
                    auVar181._8_8_ = auVar181._0_8_;
                    auVar185._16_8_ = auVar181._0_8_;
                    auVar185._0_16_ = auVar181;
                    auVar185._24_8_ = auVar181._0_8_;
                    local_280 = auVar185;
                    auVar190 = vshufps_avx(auVar195,auVar195,0xaa);
                    auVar165._0_8_ = auVar190._0_8_;
                    auVar165._8_8_ = auVar165._0_8_;
                    auVar177._16_8_ = auVar165._0_8_;
                    auVar177._0_16_ = auVar165;
                    auVar177._24_8_ = auVar165._0_8_;
                    local_260 = auVar177;
                    local_200 = CONCAT44(uStack_17c,local_180);
                    uStack_1f8 = CONCAT44(uStack_174,uStack_178);
                    uStack_1f0 = CONCAT44(uStack_16c,uStack_170);
                    uStack_1e8 = CONCAT44(uStack_164,uStack_168);
                    local_1e0 = CONCAT44(uStack_15c,local_160);
                    uStack_1d8 = CONCAT44(uStack_154,uStack_158);
                    uStack_1d0 = CONCAT44(uStack_14c,uStack_150);
                    uStack_1c8 = CONCAT44(uStack_144,uStack_148);
                    auVar128 = vpcmpeqd_avx2(local_220,local_220);
                    local_728[1] = auVar128;
                    *local_728 = auVar128;
                    local_1c0 = (local_7d0.context)->instID[0];
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_1a0 = (local_7d0.context)->instPrimID[0];
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_640 = local_2e0._0_8_;
                    uStack_638 = local_2e0._8_8_;
                    uStack_630 = local_2e0._16_8_;
                    uStack_628 = local_2e0._24_8_;
                    local_7d0.valid = (int *)&local_640;
                    local_7d0.geometryUserPtr = pGVar114->userPtr;
                    local_7d0.hit = (RTCHitN *)&local_2a0;
                    local_7d0.N = 8;
                    local_7d0.ray = (RTCRayN *)ray;
                    if (pGVar114->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar177 = ZEXT1632(auVar165);
                      auVar185 = ZEXT1632(auVar181);
                      (*pGVar114->intersectionFilterN)(&local_7d0);
                      auVar155._8_56_ = extraout_var;
                      auVar155._0_8_ = extraout_XMM1_Qa;
                      auVar218 = ZEXT3264(local_7a0);
                      auVar214 = ZEXT3264(CONCAT428(fStack_764,
                                                    CONCAT424(fStack_768,
                                                              CONCAT420(fStack_76c,
                                                                        CONCAT416(fStack_770,
                                                                                  CONCAT412(
                                                  fStack_774,
                                                  CONCAT48(fStack_778,CONCAT44(fStack_77c,local_780)
                                                          )))))));
                      auVar128 = vpcmpeqd_avx2(auVar155._0_32_,auVar155._0_32_);
                      lVar113 = local_720._0_8_;
                      pGVar114 = (Geometry *)local_680._0_8_;
                    }
                    auVar100._8_8_ = uStack_638;
                    auVar100._0_8_ = local_640;
                    auVar100._16_8_ = uStack_630;
                    auVar100._24_8_ = uStack_628;
                    auVar175 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar100);
                    auVar203 = auVar128 & ~auVar175;
                    if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar203 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar203 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar203 >> 0x7f,0) == '\0') &&
                          (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar203 >> 0xbf,0) == '\0') &&
                        (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar203[0x1f]) {
                      auVar175 = auVar175 ^ auVar128;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar114->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar177 = ZEXT1632(auVar177._0_16_);
                        auVar185 = ZEXT1632(auVar185._0_16_);
                        (*p_Var13)(&local_7d0);
                        auVar218 = ZEXT3264(local_7a0);
                        auVar214 = ZEXT3264(CONCAT428(fStack_764,
                                                      CONCAT424(fStack_768,
                                                                CONCAT420(fStack_76c,
                                                                          CONCAT416(fStack_770,
                                                                                    CONCAT412(
                                                  fStack_774,
                                                  CONCAT48(fStack_778,CONCAT44(fStack_77c,local_780)
                                                          )))))));
                        lVar113 = local_720._0_8_;
                        pGVar114 = (Geometry *)local_680._0_8_;
                      }
                      auVar101._8_8_ = uStack_638;
                      auVar101._0_8_ = local_640;
                      auVar101._16_8_ = uStack_630;
                      auVar101._24_8_ = uStack_628;
                      auVar203 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar101);
                      auVar128 = vpcmpeqd_avx2(auVar185,auVar185);
                      auVar175 = auVar203 ^ auVar128;
                      auVar229 = vpcmpeqd_avx2(auVar177,auVar177);
                      auVar128 = auVar128 & ~auVar203;
                      if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar128 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar128 >> 0x7f,0) != '\0') ||
                            (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar128 >> 0xbf,0) != '\0') ||
                          (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar128[0x1f] < '\0') {
                        auVar203 = auVar203 ^ auVar229;
                        auVar128 = vmaskmovps_avx(auVar203,*(undefined1 (*) [32])local_7d0.hit);
                        *(undefined1 (*) [32])(local_7d0.ray + 0x180) = auVar128;
                        auVar128 = vmaskmovps_avx(auVar203,*(undefined1 (*) [32])
                                                            (local_7d0.hit + 0x20));
                        *(undefined1 (*) [32])(local_7d0.ray + 0x1a0) = auVar128;
                        auVar128 = vmaskmovps_avx(auVar203,*(undefined1 (*) [32])
                                                            (local_7d0.hit + 0x40));
                        *(undefined1 (*) [32])(local_7d0.ray + 0x1c0) = auVar128;
                        auVar128 = vmaskmovps_avx(auVar203,*(undefined1 (*) [32])
                                                            (local_7d0.hit + 0x60));
                        *(undefined1 (*) [32])(local_7d0.ray + 0x1e0) = auVar128;
                        auVar128 = vmaskmovps_avx(auVar203,*(undefined1 (*) [32])
                                                            (local_7d0.hit + 0x80));
                        *(undefined1 (*) [32])(local_7d0.ray + 0x200) = auVar128;
                        auVar128 = vpmaskmovd_avx2(auVar203,*(undefined1 (*) [32])
                                                             (local_7d0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_7d0.ray + 0x220) = auVar128;
                        auVar128 = vpmaskmovd_avx2(auVar203,*(undefined1 (*) [32])
                                                             (local_7d0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_7d0.ray + 0x240) = auVar128;
                        auVar128 = vpmaskmovd_avx2(auVar203,*(undefined1 (*) [32])
                                                             (local_7d0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_7d0.ray + 0x260) = auVar128;
                        auVar128 = vpmaskmovd_avx2(auVar203,*(undefined1 (*) [32])
                                                             (local_7d0.hit + 0x100));
                        *(undefined1 (*) [32])(local_7d0.ray + 0x280) = auVar128;
                      }
                    }
                    auVar128 = local_560;
                    auVar233 = ZEXT464(uVar112);
                    if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar175 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar175 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar175 >> 0x7f,0) == '\0') &&
                          (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar175 >> 0xbf,0) == '\0') &&
                        (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar175[0x1f]) {
                      *(uint *)(ray + k * 4 + 0x100) = uVar112;
                    }
                    *(undefined4 *)(local_660 + local_920._0_8_ * 4) = 0;
                    uVar116 = *(undefined4 *)(ray + k * 4 + 0x100);
                    auVar131._4_4_ = uVar116;
                    auVar131._0_4_ = uVar116;
                    auVar131._8_4_ = uVar116;
                    auVar131._12_4_ = uVar116;
                    auVar131._16_4_ = uVar116;
                    auVar131._20_4_ = uVar116;
                    auVar131._24_4_ = uVar116;
                    auVar131._28_4_ = uVar116;
                    auVar175 = vcmpps_avx(auVar128,auVar131,2);
                    auVar203 = vandps_avx(auVar175,local_660);
                    auVar175 = local_660 & auVar175;
                    bVar91 = (auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar92 = (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar90 = (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar89 = SUB321(auVar175 >> 0x7f,0) != '\0';
                    bVar88 = (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar87 = SUB321(auVar175 >> 0xbf,0) != '\0';
                    bVar85 = (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar83 = auVar175[0x1f] < '\0';
                    if (((((((bVar91 || bVar92) || bVar90) || bVar89) || bVar88) || bVar87) ||
                        bVar85) || bVar83) {
                      auVar152._8_4_ = 0x7f800000;
                      auVar152._0_8_ = 0x7f8000007f800000;
                      auVar152._12_4_ = 0x7f800000;
                      auVar152._16_4_ = 0x7f800000;
                      auVar152._20_4_ = 0x7f800000;
                      auVar152._24_4_ = 0x7f800000;
                      auVar152._28_4_ = 0x7f800000;
                      auVar128 = vblendvps_avx(auVar152,auVar128,auVar203);
                      auVar175 = vshufps_avx(auVar128,auVar128,0xb1);
                      auVar175 = vminps_avx(auVar128,auVar175);
                      auVar229 = vshufpd_avx(auVar175,auVar175,5);
                      auVar175 = vminps_avx(auVar175,auVar229);
                      auVar229 = vpermpd_avx2(auVar175,0x4e);
                      local_660 = vminps_avx(auVar175,auVar229);
                      auVar175 = vcmpps_avx(auVar128,local_660,0);
                      auVar229 = auVar203 & auVar175;
                      auVar128 = auVar203;
                      if ((((((((auVar229 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar229 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar229 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar229 >> 0x7f,0) != '\0') ||
                            (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar229 >> 0xbf,0) != '\0') ||
                          (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar229[0x1f] < '\0') {
                        auVar128 = vandps_avx(auVar175,auVar203);
                      }
                      uVar112 = vmovmskps_avx(auVar128);
                      local_920._0_4_ = 0;
                      for (; (uVar112 & 1) == 0; uVar112 = uVar112 >> 1 | 0x80000000) {
                        local_920._0_4_ = local_920._0_4_ + 1;
                      }
                      local_920._4_4_ = 0;
                      local_920._8_24_ = auVar147._8_24_;
                    }
                    auVar179 = ZEXT3264(local_660);
                    local_660 = auVar203;
                  } while (((((((bVar91 || bVar92) || bVar90) || bVar89) || bVar88) || bVar87) ||
                           bVar85) || bVar83);
                }
              }
            }
            auVar224 = ZEXT3264(auVar132);
          }
          auVar223 = ZEXT3264(auVar121);
          lVar113 = lVar113 + 8;
        } while ((int)lVar113 < iVar107);
      }
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar129._4_4_ = uVar4;
      auVar129._0_4_ = uVar4;
      auVar129._8_4_ = uVar4;
      auVar129._12_4_ = uVar4;
      auVar129._16_4_ = uVar4;
      auVar129._20_4_ = uVar4;
      auVar129._24_4_ = uVar4;
      auVar129._28_4_ = uVar4;
      auVar121 = vcmpps_avx(local_80,auVar129,2);
      uVar110 = vmovmskps_avx(auVar121);
      uVar110 = (uint)uVar115 & uVar110;
    } while (uVar110 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }